

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastEndGroupImpl<unsigned_short>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  anon_class_24_3_6b4a22af f_01;
  anon_class_24_3_6b4a22af f_02;
  size_t sVar9;
  ErrnoSaver EVar10;
  bool bVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  FieldEntry *pFVar17;
  char *pcVar18;
  LogMessageData *in_RAX;
  undefined7 extraout_var;
  undefined4 *puVar19;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar20;
  ushort *puVar21;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_00;
  undefined7 extraout_var_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar22;
  string *psVar23;
  undefined7 extraout_var_01;
  MessageLite *pMVar24;
  TcParseTableBase *pTVar25;
  void *pvVar26;
  LogMessageData *node;
  LogMessageData *pLVar27;
  uint *puVar28;
  ulong uVar29;
  Nonnull<const_char_*> pcVar30;
  char cVar31;
  ulong uVar32;
  code *data_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 entry;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar33;
  uint *data_01;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *entry_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  LogMessageData *pLVar34;
  LogMessageData *extraout_RDX_05;
  LogMessageData *extraout_RDX_06;
  ParseContext *pPVar35;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_09;
  ParseContext *entry_01;
  ParseContext *extraout_RDX_10;
  ParseContext *extraout_RDX_11;
  ParseContext *extraout_RDX_12;
  undefined8 extraout_RDX_13;
  LogMessageData *extraout_RDX_14;
  LogMessageData *pLVar36;
  LogMessageData *extraout_RDX_15;
  ushort uVar37;
  int iVar38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar39;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this;
  ulong uVar40;
  uint7 uVar41;
  uint uVar42;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var43;
  Arena *pAVar44;
  char *pcVar45;
  LogMessageData *node_00;
  undefined8 *puVar46;
  uint16_t uVar47;
  long *plVar48;
  ushort uVar49;
  long in_R10;
  NodeBase **ppNVar50;
  int iVar51;
  undefined1 this_00 [8];
  int iVar52;
  FieldEntry *pFVar53;
  long lVar54;
  uint uVar55;
  longdouble in_ST0;
  string_view data_02;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  string_view sVar56;
  string_view sVar57;
  pair<const_char_*,_int> pVar58;
  pair<const_char_*,_int> pVar59;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var60;
  byte bStack_a1;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_80;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_78;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_70;
  NodeBase **ppNStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  ErrnoSaver EStack_40;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  
  uVar16 = (uint)hasbits;
  if (data.field_0._0_2_ == 0) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (data.field_0._2_4_ & 0xffff) - 1;
    if ((ulong)table->has_bits_offset != 0) {
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar28 & 3) != 0) {
        AlignFail();
      }
      *puVar28 = *puVar28 | uVar16;
    }
    return ptr + 2;
  }
  uVar40 = (ulong)(byte)*ptr;
  _Var43._M_head_impl = (LogMessageData *)(ptr + 1);
  if (*ptr < '\0') {
    uVar41 = (uint7)((uVar40 << 0x39) >> 8);
    cVar31 = *(char *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    lVar54 = CONCAT71(uVar41,cVar31);
    if (cVar31 < '\0') {
      uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
      lVar54 = CONCAT71(uVar41,ptr[2]);
      if (ptr[2] < '\0') {
        uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
        lVar54 = CONCAT71(uVar41,ptr[3]);
        if (ptr[3] < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            pcVar18 = Error(msg,ptr,ctx,data,table,hasbits);
            return pcVar18;
          }
          uVar40 = CONCAT71(uVar41,ptr[4]) << 0x1c | (ulong)(uVar41 >> 0x1c);
          _Var43._M_head_impl = (LogMessageData *)(ptr + 5);
        }
        else {
          uVar40 = lVar54 << 0x15 | (ulong)(uVar41 >> 0x23);
          _Var43._M_head_impl = (LogMessageData *)(ptr + 4);
        }
      }
      else {
        uVar40 = lVar54 << 0xe | (ulong)(uVar41 >> 0x2a);
        _Var43._M_head_impl = (LogMessageData *)(ptr + 3);
      }
    }
    else {
      uVar40 = lVar54 << 7 | (ulong)(uVar41 >> 0x31);
      _Var43._M_head_impl = (LogMessageData *)(ptr + 2);
    }
  }
  _EStack_40 = (LogMessageData *)0x1fe704;
  _Stack_38._M_head_impl = in_RAX;
  pFVar17 = FindFieldEntry(table,(uint)(uVar40 >> 3) & 0x1fffffff);
  if (pFVar17 == (FieldEntry *)0x0) {
    pcVar18 = (*table->fallback)(msg,(char *)_Var43._M_head_impl,ctx,
                                 (TcFieldData)(uVar40 & 0xffffffff),table,hasbits);
    return pcVar18;
  }
  uVar29 = (ulong)(uint)((int)pFVar17 - (int)table);
  uVar32 = uVar40 & 0xffffffff;
  data_00 = (code *)(uVar32 | uVar29 << 0x20);
  uVar42 = (uint)uVar40;
  switch(pFVar17->type_card & 0xf) {
  case 0:
    pcVar18 = (*table->fallback)(msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,
                                 hasbits);
    return pcVar18;
  case 1:
    pFVar17 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)pFVar17 & 3) != 0) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20ab43;
      AlignFail(pFVar17);
    }
    uVar13 = pFVar17->type_card;
    uVar16 = uVar13 & 0x30;
    if (uVar16 == 0x20) {
      pcVar18 = MpRepeatedVarint<false>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    if ((uVar40 & 7) == 0) {
      pLVar27 = (LogMessageData *)
                (long)*(char *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      if ((long)pLVar27 < 0) {
        aVar20.data = (long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len +
                                     1) << 7 | 0x7f;
        if ((long)aVar20 < 0) {
          pPVar35 = (ParseContext *)
                    ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 2
                                    ) << 0xe | 0x3fff);
          if ((long)pPVar35 < 0) {
            aVar20.data = aVar20.data &
                          ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_len + 3) << 0x15 | 0x1fffffU);
            if ((long)aVar20 < 0) {
              pPVar35 = (ParseContext *)
                        ((ulong)pPVar35 &
                        ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len
                                        + 4) << 0x1c | 0xfffffffU));
              if ((long)pPVar35 < 0) {
                aVar20.data = aVar20.data &
                              ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                      _M_len + 5) << 0x23 | 0x7ffffffffU);
                if ((long)aVar20 < 0) {
                  pPVar35 = (ParseContext *)
                            ((ulong)pPVar35 &
                            ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                    _M_len + 6) << 0x2a | 0x3ffffffffffU));
                  if ((long)pPVar35 < 0) {
                    aVar20.data = aVar20.data &
                                  ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).
                                                          full_filename_._M_len + 7) << 0x31 |
                                  0x1ffffffffffffU);
                    if ((long)aVar20 < 0) {
                      pPVar35 = (ParseContext *)
                                ((ulong)pPVar35 &
                                ((ulong)*(byte *)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_str << 0x38 | 0xffffffffffffff));
                      if ((long)pPVar35 < 0) {
                        pLVar36 = (LogMessageData *)
                                  ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_str + 2);
                        bVar12 = *(byte *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_str + 1);
                        if (bVar12 != 1) {
                          if ((char)bVar12 < '\0') {
                            pcVar18 = Error(msg,(char *)CONCAT71(0xffffffffffffff,bVar12),pPVar35,
                                            (TcFieldData)aVar20,table,hasbits);
                            return pcVar18;
                          }
                          if ((bVar12 & 1) == 0) {
                            pPVar35 = (ParseContext *)((ulong)pPVar35 ^ 0x8000000000000000);
                          }
                        }
                      }
                      else {
                        pLVar36 = (LogMessageData *)
                                  ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_str + 1);
                      }
                    }
                    else {
                      pLVar36 = (LogMessageData *)
                                &((_Var43._M_head_impl)->entry).full_filename_._M_str;
                    }
                  }
                  else {
                    pLVar36 = (LogMessageData *)
                              ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 7);
                  }
                }
                else {
                  pLVar36 = (LogMessageData *)
                            ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 6);
                }
              }
              else {
                pLVar36 = (LogMessageData *)
                          ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 5);
              }
            }
            else {
              pLVar36 = (LogMessageData *)
                        ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 4);
            }
          }
          else {
            pLVar36 = (LogMessageData *)
                      ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 3);
          }
          aVar20.data = aVar20.data & (ulong)pPVar35;
        }
        else {
          pLVar36 = (LogMessageData *)
                    ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 2);
        }
        pLVar27 = (LogMessageData *)((ulong)pLVar27 & aVar20.data);
      }
      else {
        pLVar36 = (LogMessageData *)
                  ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
      }
      uVar55 = uVar13 & 0x600;
      pPVar35 = (ParseContext *)(ulong)uVar55;
      uVar42 = uVar13 & 0x1c0;
      ppNVar50 = (NodeBase **)(ulong)uVar42;
      uVar15 = (uint)pLVar27;
      if (ppNVar50 == (NodeBase **)0xc0) {
        if (uVar55 == 0x200) {
          pLVar27 = (LogMessageData *)(-(ulong)(uVar15 & 1) ^ (ulong)pLVar27 >> 1);
        }
      }
      else if (uVar42 == 0x80) {
        if ((uVar13 >> 10 & 1) == 0) {
          if (uVar55 == 0x200) {
            pLVar27 = (LogMessageData *)
                      (long)(int)(-(uVar15 & 1) ^ (uint)((ulong)pLVar27 >> 1) & 0x7fffffff);
          }
        }
        else {
          puVar4 = *(uint32_t **)
                    ((long)&table->has_bits_offset +
                    (ulong)pFVar17->aux_idx * 8 + (ulong)table->aux_offset);
          ppNStack_68 = ppNVar50;
          if (uVar55 == 0x600) {
            if (((int)uVar15 < (int)puVar4) || ((int)((ulong)puVar4 >> 0x20) < (int)uVar15)) {
LAB_0020ab19:
              pcVar18 = MpUnknownEnumFallback
                                  (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,
                                   hasbits);
              return pcVar18;
            }
          }
          else {
            _Stack_70._M_head_impl =
                 (LogMessageData *)
                 ((ulong)CONCAT24(uVar13,_Stack_70._M_head_impl._0_4_) & 0x1c0ffffffff);
            aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20aaf4;
            uStack_60 = (code *)ctx;
            uStack_58 = pLVar36;
            uStack_50 = (code *)pLVar27;
            auStack_48 = (undefined1  [8])hasbits;
            bVar11 = ValidateEnum(uVar15,puVar4);
            ppNVar50 = ppNStack_68;
            ctx = (ParseContext *)uStack_60;
            hasbits = (uint64_t)auStack_48;
            pLVar27 = (LogMessageData *)uStack_50;
            pLVar36 = uStack_58;
            uVar42 = _Stack_70._M_head_impl._4_4_;
            if (!bVar11) goto LAB_0020ab19;
          }
        }
      }
      _Var43._M_head_impl = pLVar36;
      if (uVar16 == 0x30) {
        _Stack_70._M_head_impl._4_4_ = uVar42;
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20aa01;
        ppNStack_68 = ppNVar50;
        uStack_60 = (code *)ctx;
        ChangeOneof(table,pFVar17,(uint)((ulong)data_00 >> 3) & 0x1fffffff,pPVar35,msg);
        ppNVar50 = ppNStack_68;
        ctx = (ParseContext *)uStack_60;
        uVar42 = _Stack_70._M_head_impl._4_4_;
      }
      else if (uVar16 == 0x10) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar17->has_idx >> 5) * 4)
        ;
        if (((ulong)puVar28 & 3) != 0) goto LAB_0020ab9f;
        *puVar28 = *puVar28 | 1 << ((byte)pFVar17->has_idx & 0x1f);
      }
      if (uVar42 == 0xc0) {
        puVar46 = (undefined8 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar17->offset);
        if (((ulong)puVar46 & 7) != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20aba9;
          AlignFail();
        }
        *puVar46 = pLVar27;
      }
      else if (uVar42 == 0x80) {
        puVar19 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar17->offset);
        if (((ulong)puVar19 & 3) != 0) {
LAB_0020ab9f:
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20aba4;
          AlignFail();
        }
        *puVar19 = (int)pLVar27;
      }
      else {
        if (uVar42 != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20abc2;
          pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((long)ppNVar50,0,
                               "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20abde;
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffffc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x829,pcVar30);
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20abe6;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffffc0);
        }
        *(bool *)((long)&msg->_vptr_MessageLite + (ulong)pFVar17->offset) =
             pLVar27 != (LogMessageData *)0x0;
      }
      if ((LogMessageData *)(((LogMessageData *)ctx)->entry).full_filename_._M_len <=
          _Var43._M_head_impl) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar28 & 3) != 0) {
            aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20abb1;
            AlignFail(puVar28);
          }
          *puVar28 = *puVar28 | (uint)hasbits;
        }
        return (char *)_Var43._M_head_impl;
      }
      uVar13 = *(ushort *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
      if ((uVar16 & 7) != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20abfe;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar40 = (ulong)(uVar16 & 0xfffffff8);
      data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
      UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
    }
    else {
      UNRECOVERED_JUMPTABLE_00 = table->fallback;
    }
    pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 2:
    uVar29 = (long)&table->has_bits_offset + uVar29;
    if ((uVar29 & 3) != 0) {
      AlignFail(uVar29);
    }
    if ((uVar42 & 7) != 2) {
      pcVar18 = MpRepeatedVarint<false>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar13 = *(ushort *)(uVar29 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar28 & 3) != 0) {
        AlignFail(puVar28);
      }
      *puVar28 = *puVar28 | uVar16;
    }
    uVar37 = uVar13 >> 6;
    uVar49 = uVar37 & 7;
    if ((uVar37 & 7) == 0) {
      pcVar18 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar16 = uVar13 & 0x600;
    if (uVar49 == 2) {
      switch(uVar16) {
      default:
        pcVar18 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      case 0x200:
      case 0x220:
      case 0x240:
      case 0x260:
      case 0x280:
      case 0x2a0:
      case 0x2c0:
      case 0x2e0:
      case 0x300:
      case 800:
      case 0x340:
      case 0x360:
      case 0x380:
      case 0x3a0:
      case 0x3c0:
      case 0x3e0:
        pcVar18 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      case 0x400:
      case 0x420:
      case 0x440:
      case 0x460:
      case 0x480:
      case 0x4a0:
      case 0x4c0:
      case 0x4e0:
      case 0x500:
      case 0x520:
      case 0x540:
      case 0x560:
      case 0x580:
      case 0x5a0:
      case 0x5c0:
      case 0x5e0:
        pcVar18 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      case 0x600:
      case 0x620:
      case 0x640:
      case 0x660:
      case 0x680:
      case 0x6a0:
      case 0x6c0:
      case 0x6e0:
      case 0x700:
      case 0x720:
      case 0x740:
      case 0x760:
      case 0x780:
      case 0x7a0:
      case 0x7c0:
      case 0x7e0:
        pcVar18 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      }
    }
    if (uVar49 != 3) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    if ((short)uVar16 == 0) {
      pcVar18 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    if (uVar16 != 0x200) {
      pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar16,0x200,"xform_val == +field_layout::kTvZigZag");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffe8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar30);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffe8);
    }
    pcVar18 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 3:
    pFVar17 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)pFVar17 & 3) != 0) {
      uStack_50._0_1_ = 'j';
      uStack_50._1_1_ = -0x51;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      AlignFail(pFVar17);
    }
    uVar13 = pFVar17->type_card & 0x30;
    if (uVar13 == 0x20) {
      pcVar18 = MpRepeatedFixed<false>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar16 = pFVar17->type_card & 0x1c0;
    if ((ulong)uVar16 == 0xc0) {
      if ((uVar42 & 7) != 1) {
LAB_0020ae99:
        UNRECOVERED_JUMPTABLE_00 = table->fallback;
        goto LAB_0020af1e;
      }
    }
    else {
      if (uVar16 != 0x80) {
        uStack_50._0_1_ = '~';
        uStack_50._1_1_ = -0x51;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar16,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uStack_50._0_1_ = -0x66;
        uStack_50._1_1_ = -0x51;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar30);
        uStack_50._0_1_ = -0x5e;
        uStack_50._1_1_ = -0x51;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0);
      }
      if ((uVar42 & 7) != 5) goto LAB_0020ae99;
    }
    if (uVar13 == 0x30) {
      uStack_50 = (code *)0x20aeb6;
      auStack_48 = (undefined1  [8])hasbits;
      ChangeOneof(table,pFVar17,uVar42 >> 3,(ParseContext *)(ulong)(uVar42 >> 3),msg);
      hasbits = (uint64_t)auStack_48;
    }
    else if (uVar13 == 0x10) {
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar17->has_idx >> 5) * 4);
      if (((ulong)puVar28 & 3) != 0) goto LAB_0020afa2;
      *puVar28 = *puVar28 | 1 << ((byte)pFVar17->has_idx & 0x1f);
    }
    puVar46 = (undefined8 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar17->offset);
    if (uVar16 == 0xc0) {
      if (((ulong)puVar46 & 7) != 0) {
        uStack_50._0_1_ = -0x54;
        uStack_50._1_1_ = -0x51;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        AlignFail();
      }
      *puVar46 = (NodeBase *)((_Var43._M_head_impl)->entry).full_filename_._M_len;
      lVar54 = 8;
    }
    else {
      if (((ulong)puVar46 & 3) != 0) {
LAB_0020afa2:
        uStack_50._0_1_ = -0x59;
        uStack_50._1_1_ = -0x51;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        AlignFail();
      }
      *(undefined4 *)puVar46 = *(undefined4 *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      lVar54 = 4;
    }
    _Var43._M_head_impl =
         (LogMessageData *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + lVar54);
    if ((LogMessageData *)(ctx->super_EpsCopyInputStream).limit_end_ <= _Var43._M_head_impl) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar28 & 3) != 0) {
          uStack_50._0_1_ = -0x4c;
          uStack_50._1_1_ = -0x51;
          uStack_50._2_1_ = ' ';
          uStack_50._3_1_ = '\0';
          uStack_50._4_1_ = '\0';
          uStack_50._5_1_ = '\0';
          uStack_50._6_1_ = '\0';
          uStack_50._7_1_ = '\0';
          AlignFail(puVar28);
        }
        *puVar28 = *puVar28 | (uint)hasbits;
      }
      return (char *)_Var43._M_head_impl;
    }
    uVar13 = *(ushort *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
    if ((uVar16 & 7) != 0) {
      uStack_50 = MpPackedFixed<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar16 & 0xfffffff8);
    data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
    UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
LAB_0020af1e:
    pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 4:
    puVar28 = (uint *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)puVar28 & 3) != 0) {
      uStack_50._0_1_ = '\x01';
      uStack_50._1_1_ = -0x4f;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      AlignFail(puVar28);
    }
    if ((uVar42 & 7) != 2) {
      pcVar18 = MpRepeatedFixed<false>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar13 = *(ushort *)((long)puVar28 + 10);
    bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    if ((char)bVar12 < '\0') {
      uStack_50._0_1_ = '>';
      uStack_50._1_1_ = -0x50;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
      auVar5 = pVar58._0_12_;
    }
    else {
      auVar5[8] = bVar12;
      auVar5._0_8_ = (undefined1 *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1)
      ;
      auVar5._9_3_ = 0;
    }
    pcVar18 = auVar5._0_8_;
    uVar42 = uVar13 & 0x1c0;
    if ((ulong)uVar42 == 0xc0) {
      aVar20.data = (long)&msg->_vptr_MessageLite + (ulong)*puVar28;
      if ((aVar20.data & 7) != 0) {
LAB_0020b101:
        uStack_50._0_1_ = '\t';
        uStack_50._1_1_ = -0x4f;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        AlignFail(aVar20.data);
      }
      uStack_50._0_1_ = 'h';
      uStack_50._1_1_ = -0x50;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      puVar21 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          (&ctx->super_EpsCopyInputStream,pcVar18,auVar5._8_4_,
                           (RepeatedField<unsigned_long> *)aVar20);
      pPVar35 = extraout_RDX;
    }
    else {
      if (uVar42 != 0x80) {
        uStack_50._0_1_ = '9';
        uStack_50._1_1_ = -0x4f;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar42,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uStack_50._0_1_ = 'U';
        uStack_50._1_1_ = -0x4f;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar30);
        uStack_50._0_1_ = ']';
        uStack_50._1_1_ = -0x4f;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0);
      }
      aVar20.data = (long)&msg->_vptr_MessageLite + (ulong)*puVar28;
      if ((aVar20.data & 7) != 0) goto LAB_0020b101;
      uStack_50._0_1_ = -0x76;
      uStack_50._1_1_ = -0x50;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      puVar21 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          (&ctx->super_EpsCopyInputStream,pcVar18,auVar5._8_4_,
                           (RepeatedField<unsigned_int> *)aVar20);
      pPVar35 = extraout_RDX_00;
    }
    if (puVar21 == (ushort *)0x0) {
      pcVar18 = Error(msg,pcVar18,pPVar35,(TcFieldData)aVar20,table,hasbits);
      return pcVar18;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar21) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar28 & 3) != 0) {
          uStack_50._0_1_ = 'e';
          uStack_50._1_1_ = -0x4f;
          uStack_50._2_1_ = ' ';
          uStack_50._3_1_ = '\0';
          uStack_50._4_1_ = '\0';
          uStack_50._5_1_ = '\0';
          uStack_50._6_1_ = '\0';
          uStack_50._7_1_ = '\0';
          AlignFail(puVar28);
        }
        *puVar28 = *puVar28 | uVar16;
      }
      return (char *)puVar21;
    }
    uVar16 = (uint)table->fast_idx_mask & (uint)*puVar21;
    if ((uVar16 & 7) != 0) {
      uStack_50 = (code *)&UNK_0020b17d;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar16 & 0xfffffff8);
    pcVar18 = (char *)(**(code **)(&table[1].has_bits_offset + uVar40))
                                (msg,puVar21,ctx,
                                 (ulong)*puVar21 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2),
                                 table,hasbits);
    return pcVar18;
  case 6:
    pFVar53 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    pFVar17 = pFVar53;
    if (((ulong)pFVar53 & 3) != 0) {
LAB_0020b905:
      uStack_60 = (code *)0x20b90a;
      AlignFail(pFVar17);
    }
    uVar13 = pFVar53->type_card;
    uVar37 = uVar13 & 0x30;
    if (uVar37 == 0x20) {
      if ((uVar13 & 0x1c0) == 0x40) {
        pcVar18 = MpRepeatedMessageOrGroup<false,true>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      }
      if ((uVar13 & 0x1c0) == 0) {
        pcVar18 = MpRepeatedMessageOrGroup<false,false>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      }
LAB_0020b6ce:
      pcVar18 = (*table->fallback)(msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,
                                   hasbits);
      return pcVar18;
    }
    uVar55 = uVar42 & 7;
    if ((uVar13 & 0x1c0) == 0x40) {
      if (uVar55 != 3) goto LAB_0020b6ce;
    }
    else if (((uVar13 & 0x1c0) != 0) || (uVar55 != 2)) goto LAB_0020b6ce;
    if (uVar37 == 0x30) {
      uStack_60 = (code *)0x20b70f;
      uStack_58 = (LogMessageData *)ctx;
      uStack_50 = (code *)_Var43._M_head_impl;
      _Stack_38._M_head_impl = (LogMessageData *)msg;
      bVar11 = ChangeOneof(table,pFVar53,(uint32_t)(uVar32 >> 3),(ParseContext *)(ulong)uVar55,msg);
      uVar40 = CONCAT71(extraout_var,bVar11);
      _Var43._M_head_impl = (LogMessageData *)uStack_50;
      msg = (MessageLite *)_Stack_38._M_head_impl;
    }
    else {
      if (uVar37 == 0x10) {
        pFVar17 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar53->has_idx >> 5) * 4);
        uStack_58 = (LogMessageData *)ctx;
        if (((ulong)pFVar17 & 3) != 0) goto LAB_0020b905;
        pFVar17->offset = pFVar17->offset | 1 << ((byte)pFVar53->has_idx & 0x1f);
      }
      uVar40 = 0;
      uStack_58 = (LogMessageData *)ctx;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar17 = (FieldEntry *)((ulong)table->has_bits_offset + (long)msg);
      if (((ulong)pFVar17 & 3) != 0) goto LAB_0020b905;
      pFVar17->offset = pFVar17->offset | uVar16;
    }
    plVar48 = (long *)((ulong)pFVar53->offset + (long)msg);
    if (((ulong)plVar48 & 7) != 0) {
      uStack_60 = (code *)0x20b912;
      AlignFail(plVar48);
    }
    pTVar25 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar53->aux_idx * 8 + (ulong)table->aux_offset);
    uVar37 = uVar13 >> 9 & 3;
    if (uVar37 != 2) {
      uStack_50 = (code *)CONCAT44(uStack_50._4_4_,(int)uVar40);
      if ((uVar13 >> 9 & 3) == 0) {
        pcVar45 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar18 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar38 = 0x9c8;
        goto LAB_0020b9bd;
      }
      if (uVar37 != 1) {
        pTVar25 = *(TcParseTableBase **)pTVar25;
      }
      uStack_60 = (code *)0x20b930;
      pTVar25 = MessageLite::GetTcParseTable((MessageLite *)pTVar25);
      uVar40 = (ulong)uStack_50 & 0xffffffff;
    }
    if ((byte)((byte)uVar40 | *plVar48 == 0) == 1) {
      pAVar44 = *(Arena **)((long)msg + 8);
      if (((ulong)pAVar44 & 1) != 0) {
        pAVar44 = *(Arena **)((ulong)pAVar44 & 0xfffffffffffffffe);
      }
      uStack_60 = (code *)0x20b78e;
      pMVar24 = ClassData::New(pTVar25->class_data,pAVar44);
      *plVar48 = (long)pMVar24;
    }
    pLVar27 = uStack_58;
    if ((uVar13 & 0x1c0) == 0x40) {
      iVar38 = (int)(uStack_58->entry).encoding_._M_len;
      uVar16 = iVar38 - 1;
      *(uint *)&(uStack_58->entry).encoding_._M_len = uVar16;
      if (iVar38 < 1) {
        return (char *)0x0;
      }
      iVar51 = *(int *)((long)&(uStack_58->entry).encoding_._M_len + 4);
      iVar52 = (int)((long)iVar51 + 1);
      *(int *)((long)&(uStack_58->entry).encoding_._M_len + 4) = iVar52;
      uStack_60 = (code *)0x20b7d6;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar48,(char *)_Var43._M_head_impl,
                           (ParseContext *)uStack_58,pTVar25);
      if (pcVar18 == (char *)0x0) {
        iVar51 = *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4) + -1;
        iVar38 = (int)(pLVar27->entry).encoding_._M_len + 1;
LAB_0020b8db:
        *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4) = iVar51;
        *(int *)&(pLVar27->entry).encoding_._M_len = iVar38;
        sVar9 = (pLVar27->entry).prefix_len_;
        *(uint32_t *)&(pLVar27->entry).prefix_len_ = 0;
        if ((uint)sVar9 == uVar42) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      uVar55 = (uint)(pLVar27->entry).encoding_._M_len;
      if (uVar16 == uVar55) {
        iVar2 = *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4);
        if (iVar52 == iVar2) goto LAB_0020b8db;
        uStack_60 = (code *)0x20b80b;
        pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar51 + 1,(long)iVar2,"old_group_depth == group_depth_");
        iVar38 = 0x492;
      }
      else {
        uStack_60 = (code *)0x20b97e;
        pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar16,(long)(int)uVar55,"old_depth == depth_");
        iVar38 = 0x491;
      }
    }
    else {
      bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      if ((char)bVar12 < '\0') {
        uStack_60 = (code *)0x20b83b;
        pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
        pcVar18 = pVar58.first;
        if (pcVar18 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pcVar18 = (char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
      }
      if ((int)(uStack_58->entry).encoding_._M_len < 1) {
        return (char *)0x0;
      }
      uStack_60 = (code *)0x20b869;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)auStack_48,(char *)uStack_58,(int)pcVar18)
      ;
      lVar54 = (long)(int)(uStack_58->entry).encoding_._M_len + -1;
      iVar51 = (int)lVar54;
      *(int *)&(uStack_58->entry).encoding_._M_len = iVar51;
      uStack_60 = (code *)0x20b892;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar48,pcVar18,(ParseContext *)uStack_58,pTVar25);
      iVar38 = (int)(uStack_58->entry).encoding_._M_len;
      if ((pcVar18 == (char *)0x0) || (iVar51 == iVar38)) {
        *(int *)&(uStack_58->entry).encoding_._M_len = iVar38 + 1;
        uVar16 = auStack_48._0_4_ + *(int *)((long)&(uStack_58->entry).base_filename_._M_str + 4);
        *(uint *)((long)&(uStack_58->entry).base_filename_._M_str + 4) = uVar16;
        if ((uint32_t)(uStack_58->entry).prefix_len_ != 0) {
          return (char *)0x0;
        }
        (uStack_58->entry).full_filename_._M_len =
             (size_t)((uStack_58->entry).full_filename_._M_str + (int)((int)uVar16 >> 0x1f & uVar16)
                     );
        return pcVar18;
      }
      uStack_60 = (code *)0x20b9a6;
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (lVar54,(long)iVar38,"old_depth == depth_");
      iVar38 = 0x481;
    }
    pcVar45 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_0020b9bd:
    uStack_60 = (code *)0x20b9c2;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)auStack_48,pcVar45,iVar38,pcVar18);
    uStack_60 = MpMap<false>;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)auStack_48);
  case 7:
    uStack_50 = (code *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)uStack_50 & 3) != 0) {
      AlignFail(uStack_50);
    }
    aStack_80.data =
         (long)&table->has_bits_offset +
         (ulong)((FieldEntry *)uStack_50)->aux_idx * 8 + (ulong)table->aux_offset;
    bStack_a1 = *(byte *)(aStack_80.data + 4);
    if (((bStack_a1 & 1) == 0) || ((uVar42 & 7) != 2)) {
      pcVar18 = MpFallback(msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar1 = *(undefined4 *)
             ((long)&table->has_bits_offset +
             (ulong)((FieldEntry *)uStack_50)->aux_idx * 8 + (ulong)table->aux_offset);
    this._M_head_impl =
         (LogMessageData *)
         ((long)&msg->_vptr_MessageLite + (ulong)((FieldEntry *)uStack_50)->offset);
    if ((bStack_a1 & 2) == 0) {
      if (((ulong)this._M_head_impl & 7) != 0) {
LAB_0020bedc:
        AlignFail(this._M_head_impl);
      }
      if (((ulong)((this._M_head_impl)->entry).full_filename_._M_len & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(this._M_head_impl,1);
      }
      this._M_head_impl = (LogMessageData *)&((this._M_head_impl)->entry).base_filename_;
    }
    else if (((ulong)this._M_head_impl & 7) != 0) goto LAB_0020bedc;
    uStack_58 = (LogMessageData *)(ulong)CONCAT14(bStack_a1,uVar1);
    do {
      pLVar36 = (LogMessageData *)
                (ulong)*(ushort *)((long)&((this._M_head_impl)->entry).full_filename_._M_str + 4);
      node = (LogMessageData *)UntypedMapBase::AllocNode(this._M_head_impl,(size_t)pLVar36);
      uVar29 = (ulong)*(ushort *)((long)&((this._M_head_impl)->entry).full_filename_._M_str + 4);
      uVar40 = uVar29 - 8;
      if (uVar40 < 8) {
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar40,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar38 = 0xb2c;
LAB_0020bea3:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&_Stack_78,pcVar18,iVar38,pcVar30);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&_Stack_78);
      }
      (node->entry).full_filename_._M_str = (char *)0x0;
      *(undefined8 *)((long)node + (uVar29 - 8)) = 0;
      f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
             *)auStack_48;
      f.this = (UntypedMapBase *)this._M_head_impl;
      f.node = (NodeBase **)&uStack_60;
      _Stack_78._M_head_impl = this._M_head_impl;
      _Stack_70._M_head_impl = (LogMessageData *)auStack_48;
      ppNStack_68 = (NodeBase **)&uStack_60;
      uStack_60 = (code *)node;
      auStack_48 = (undefined1  [8])this._M_head_impl;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this._M_head_impl,f);
      _EStack_40 = (LogMessageData *)&aStack_80;
      f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)auStack_48;
      f_00.this = (UntypedMapBase *)this._M_head_impl;
      f_00.node = (NodeBase **)&uStack_60;
      _Stack_78._M_head_impl = this._M_head_impl;
      _Stack_70._M_head_impl = (LogMessageData *)auStack_48;
      ppNStack_68 = (NodeBase **)&uStack_60;
      uStack_60 = (code *)node;
      auStack_48 = (undefined1  [8])this._M_head_impl;
      _Stack_38._M_head_impl = this._M_head_impl;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this._M_head_impl,f_00);
      bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      aVar22.data._1_7_ = 0;
      aVar22.data._0_1_ = bVar12;
      if ((char)bVar12 < '\0') {
        pLVar36 = (LogMessageData *)(ulong)(uint)bVar12;
        pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
        pLVar34 = pVar58._8_8_;
        if (pVar58.first == (char *)0x0) goto LAB_0020bda0;
        aVar22.data = (ulong)pLVar34 & 0xffffffff;
      }
      else {
        pVar58._8_8_ = extraout_RDX_04;
        pVar58.first = (char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
      }
      pLVar34 = pVar58._8_8_;
      node_00 = (LogMessageData *)pVar58.first;
      if (ctx->depth_ < 1) {
LAB_0020bda0:
        if (((this._M_head_impl)->entry).base_filename_._M_str == (char *)0x0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)this._M_head_impl,(NodeBase *)node);
          pLVar34 = extraout_RDX_06;
          pLVar36 = node;
        }
        pcVar18 = Error(msg,(char *)pLVar36,(ParseContext *)pLVar34,(TcFieldData)aVar22,table,
                        hasbits);
        return pcVar18;
      }
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&_Stack_78,(char *)ctx,(int)pVar58.first);
      EVar10.saved_errno_ = _Stack_78._M_head_impl._0_4_;
      iVar38 = ctx->depth_;
      uVar40 = (long)iVar38 - 1;
      ctx->depth_ = (int)uVar40;
      aVar22 = aStack_80;
      _Var43._M_head_impl = node;
      pTVar25 = table;
      pFVar17 = (FieldEntry *)uStack_50;
      _Var60._M_head_impl = this._M_head_impl;
      pLVar27 = (LogMessageData *)
                ParseOneMapEntry((NodeBase *)node,(char *)node_00,ctx,(FieldAux *)aStack_80,table,
                                 (FieldEntry *)uStack_50,this._M_head_impl);
      iVar51 = ctx->depth_;
      if ((pLVar27 != (LogMessageData *)0x0) && ((int)uVar40 != iVar51)) {
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (uVar40,(long)iVar51,"old_depth == depth_");
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar38 = 0x481;
        goto LAB_0020bea3;
      }
      ctx->depth_ = iVar51 + 1;
      uVar55 = EVar10.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar55;
      pLVar34 = extraout_RDX_05;
      pLVar36 = node_00;
      if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
         ((ctx->super_EpsCopyInputStream).limit_end_ =
               (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar55 >> 0x1f & uVar55),
         pLVar27 == (LogMessageData *)0x0)) goto LAB_0020bda0;
      pLVar36 = extraout_RDX_05;
      if ((bStack_a1 & 0x10) == 0) {
LAB_0020bc35:
        uVar15 = *(uint *)((long)&((this._M_head_impl)->entry).full_filename_._M_str + 4);
        if (5 < ((byte)(uVar15 >> 0x18) & 0xf)) {
switchD_0020bc5a_caseD_3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        }
        uVar14 = uVar15 >> 0x18 & 0xf;
        data_01 = &switchD_0020bc5a::switchdataD_002c0f20;
        uVar15 = (&switchD_0020bc5a::switchdataD_002c0f20)[uVar14];
        puVar28 = (uint *)((long)&switchD_0020bc5a::switchdataD_002c0f20 + (long)(int)uVar15);
        switch(uVar14) {
        case 0:
          KeyMapBase<bool>::InsertOrReplaceNode
                    ((KeyMapBase<bool> *)this._M_head_impl,(KeyNode *)node);
          break;
        case 1:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)this._M_head_impl,(KeyNode *)node);
          break;
        case 2:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)this._M_head_impl,(KeyNode *)node);
          break;
        default:
          goto switchD_0020bc5a_caseD_3;
        case 5:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this._M_head_impl,(KeyNode *)node);
          break;
        case 6:
          LOCK();
          pcVar18 = pLVar36[-0x437e].encoded_buf._M_elems + 0x16f0 + (long)puVar28;
          uVar1 = *(undefined4 *)pcVar18;
          *(int *)pcVar18 = (int)node_00;
          node_00 = (LogMessageData *)CONCAT44((int)((ulong)node_00 >> 0x20),uVar1);
          UNLOCK();
          cVar31 = ' ';
          if ((long)puVar28 < 0) {
            cVar31 = (char)*(undefined4 *)((long)iVar38 + 0xb3a6f0c);
          }
          pcVar18 = (char *)((long)&UINT_002c0f80 + (long)(int)uVar15 + 3);
          *pcVar18 = *pcVar18 + cVar31;
          uVar15 = (uint)(byte)((char)puVar28 + 0x81);
          goto code_r0x0020d4bf;
        case 7:
          _DAT_00dc4b8e = (short)in_ST0;
          goto code_r0x0020d4e5;
        case 8:
          uVar15 = (uint)puVar28 | *puVar28;
          goto code_r0x0020d4bf;
        case 9:
        case 10:
          goto LAB_0020d75a;
        case 0xb:
          _DAT_00dc4b8e = (short)in_ST0;
          goto code_r0x0020d4d8;
        case 0xc:
          if ((short)puVar28 == 0) {
            pcVar18 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                                ((MessageLite *)_Var43._M_head_impl,(char *)node_00,
                                 (ParseContext *)pLVar36,(TcFieldData)0x2c0f20,pTVar25,
                                 (uint64_t)pFVar17);
            return pcVar18;
          }
          bVar11 = ((uint)puVar28 & 0xffff) == 0x200;
          goto code_r0x0020d847;
        case 0xd:
          pcVar18 = MpRepeatedVarintT<false,bool,(unsigned_short)0>
                              ((MessageLite *)_Var43._M_head_impl,(char *)node_00,
                               (ParseContext *)pLVar36,(TcFieldData)0x2c0f20,pTVar25,
                               (uint64_t)pFVar17);
          return pcVar18;
        case 0xe:
          pcVar18 = (char *)(*(code *)((long)puVar28 + in_R10))();
          return pcVar18;
        case 0xf:
          pcVar18 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                              ((MessageLite *)_Var43._M_head_impl,(char *)node_00,
                               (ParseContext *)pLVar36,(TcFieldData)0x2c0f20,pTVar25,
                               (uint64_t)pFVar17);
          return pcVar18;
        }
      }
      else {
        puVar28 = (uint *)UntypedMapBase::GetValue<int>
                                    ((UntypedMapBase *)this._M_head_impl,(NodeBase *)node);
        uVar15 = *puVar28;
        puVar28 = *(uint **)(aStack_80.data + 8);
        node_00 = (LogMessageData *)(long)(short)*puVar28;
        _Var43._M_head_impl = (LogMessageData *)(ulong)(*puVar28 >> 0x10);
        pLVar36 = (LogMessageData *)
                  (((long)(int)uVar15 - (long)node_00) - (long)_Var43._M_head_impl);
        if ((LogMessageData *)((long)(int)uVar15 - (long)node_00) < _Var43._M_head_impl)
        goto LAB_0020bc35;
        uVar14 = puVar28[1];
        node_00 = (LogMessageData *)(ulong)uVar14;
        _Var43._M_head_impl = (LogMessageData *)(ulong)(ushort)uVar14;
        if (_Var43._M_head_impl <= pLVar36) {
          pLVar36 = (LogMessageData *)(ulong)(uVar14 >> 0x10);
          node_00 = (LogMessageData *)0x0;
          do {
            if (pLVar36 <= node_00) goto LAB_0020bcec;
            uVar3 = *(uint *)((long)puVar28 + (long)node_00 * 4 + (ulong)(uVar14 >> 3 & 0x1ffc) + 8)
            ;
            _Var43._M_head_impl = (LogMessageData *)(ulong)uVar3;
            pTVar25 = (TcParseTableBase *)(ulong)((int)uVar15 < (int)uVar3);
            node_00 = (LogMessageData *)(((long)node_00 * 2 - (long)pTVar25) + 2);
          } while (uVar3 != uVar15);
          goto LAB_0020bc35;
        }
        if ((puVar28[((ulong)pLVar36 >> 5) + 2] >> ((uint)pLVar36 & 0x1f) & 1) != 0)
        goto LAB_0020bc35;
LAB_0020bcec:
        WriteMapEntryAsUnknown
                  (msg,table,(UntypedMapBase *)this._M_head_impl,uVar42,(NodeBase *)node,
                   SUB85(uStack_58,0));
      }
      if ((LogMessageData *)(ctx->super_EpsCopyInputStream).limit_end_ <= pLVar27) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar28 & 3) != 0) {
            AlignFail();
          }
          *puVar28 = *puVar28 | uVar16;
        }
        return (char *)pLVar27;
      }
      bVar12 = *(byte *)&(pLVar27->entry).full_filename_._M_len;
      uVar55 = (uint)bVar12;
      _Var43._M_head_impl = (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 1);
      if ((char)bVar12 < '\0') {
        uVar41 = (uint7)(((ulong)bVar12 << 0x39) >> 8);
        cVar31 = *(char *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
        lVar54 = CONCAT71(uVar41,cVar31);
        if (cVar31 < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
          cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 2);
          lVar54 = CONCAT71(uVar41,cVar31);
          if (cVar31 < '\0') {
            uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
            cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 3);
            lVar54 = CONCAT71(uVar41,cVar31);
            if (cVar31 < '\0') {
              uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
              cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 4);
              if (cVar31 < '\0') {
                uVar55 = 0;
                _Var43._M_head_impl = (LogMessageData *)0x0;
              }
              else {
                uVar55 = (int)CONCAT71(uVar41,cVar31) << 0x1c | (uint)(uVar41 >> 0x1c);
                _Var43._M_head_impl =
                     (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 5);
              }
            }
            else {
              uVar55 = (int)lVar54 << 0x15 | (uint)(uVar41 >> 0x23);
              _Var43._M_head_impl =
                   (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 4);
            }
          }
          else {
            uVar55 = (int)lVar54 << 0xe | (uint)(uVar41 >> 0x2a);
            _Var43._M_head_impl =
                 (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 3);
          }
        }
        else {
          uVar55 = (int)lVar54 << 7 | (uint)(((ulong)bVar12 << 0x39) >> 0x39);
          _Var43._M_head_impl =
               (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 2);
        }
      }
      if (uVar55 != uVar42) {
        uVar13 = *(ushort *)&(pLVar27->entry).full_filename_._M_len;
        uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
        if ((uVar16 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar40 = (ulong)(uVar16 & 0xfffffff8);
        pcVar18 = (char *)(**(code **)(&table[1].has_bits_offset + uVar40))
                                    (msg,pLVar27,ctx,
                                     (ulong)uVar13 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2),table,hasbits)
        ;
        return pcVar18;
      }
    } while( true );
  case 8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar28 & 3) != 0) {
        AlignFail();
      }
      *puVar28 = *puVar28 | uVar16;
    }
    return (char *)0x0;
  case 9:
    pFVar17 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)pFVar17 & 3) != 0) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c1e4;
      AlignFail(pFVar17);
    }
    uVar13 = pFVar17->type_card;
    uVar16 = uVar13 & 0x30;
    if (uVar16 == 0x20) {
      pcVar18 = MpRepeatedVarint<true>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    if ((uVar40 & 7) == 0) {
      ppNVar50 = (NodeBase **)(long)*(char *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      if ((long)ppNVar50 < 0) {
        aVar20.data = (long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len +
                                     1) << 7 | 0x7f;
        if ((long)aVar20 < 0) {
          pPVar35 = (ParseContext *)
                    ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 2
                                    ) << 0xe | 0x3fff);
          if ((long)pPVar35 < 0) {
            aVar20.data = aVar20.data &
                          ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_len + 3) << 0x15 | 0x1fffffU);
            if ((long)aVar20 < 0) {
              pPVar35 = (ParseContext *)
                        ((ulong)pPVar35 &
                        ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len
                                        + 4) << 0x1c | 0xfffffffU));
              if ((long)pPVar35 < 0) {
                aVar20.data = aVar20.data &
                              ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                      _M_len + 5) << 0x23 | 0x7ffffffffU);
                if ((long)aVar20 < 0) {
                  pPVar35 = (ParseContext *)
                            ((ulong)pPVar35 &
                            ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                    _M_len + 6) << 0x2a | 0x3ffffffffffU));
                  if ((long)pPVar35 < 0) {
                    aVar20.data = aVar20.data &
                                  ((long)*(char *)((long)&((_Var43._M_head_impl)->entry).
                                                          full_filename_._M_len + 7) << 0x31 |
                                  0x1ffffffffffffU);
                    if ((long)aVar20 < 0) {
                      pPVar35 = (ParseContext *)
                                ((ulong)pPVar35 &
                                ((ulong)*(byte *)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_str << 0x38 | 0xffffffffffffff));
                      if ((long)pPVar35 < 0) {
                        _Stack_70._M_head_impl =
                             (LogMessageData *)
                             ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_str + 2);
                        bVar12 = *(byte *)((long)&((_Var43._M_head_impl)->entry).full_filename_.
                                                  _M_str + 1);
                        if (bVar12 != 1) {
                          if ((char)bVar12 < '\0') {
                            pcVar18 = Error(msg,(char *)CONCAT71((int7)((ulong)_Stack_70.
                                                                               _M_head_impl >> 8),
                                                                 bVar12),pPVar35,(TcFieldData)aVar20
                                            ,table,hasbits);
                            return pcVar18;
                          }
                          if ((bVar12 & 1) == 0) {
                            pPVar35 = (ParseContext *)((ulong)pPVar35 ^ 0x8000000000000000);
                          }
                        }
                      }
                      else {
                        _Stack_70._M_head_impl =
                             (LogMessageData *)
                             ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_str + 1);
                      }
                    }
                    else {
                      _Stack_70._M_head_impl =
                           (LogMessageData *)&((_Var43._M_head_impl)->entry).full_filename_._M_str;
                    }
                  }
                  else {
                    _Stack_70._M_head_impl =
                         (LogMessageData *)
                         ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 7);
                  }
                }
                else {
                  _Stack_70._M_head_impl =
                       (LogMessageData *)
                       ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 6);
                }
              }
              else {
                _Stack_70._M_head_impl =
                     (LogMessageData *)
                     ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 5);
              }
            }
            else {
              _Stack_70._M_head_impl =
                   (LogMessageData *)
                   ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 4);
            }
          }
          else {
            _Stack_70._M_head_impl =
                 (LogMessageData *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 3)
            ;
          }
          aVar20.data = aVar20.data & (ulong)pPVar35;
        }
        else {
          _Stack_70._M_head_impl =
               (LogMessageData *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 2);
        }
        ppNVar50 = (NodeBase **)((ulong)ppNVar50 & aVar20.data);
      }
      else {
        _Stack_70._M_head_impl =
             (LogMessageData *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
      }
      uVar55 = uVar13 & 0x600;
      pPVar35 = (ParseContext *)(ulong)uVar55;
      uVar42 = uVar13 & 0x1c0;
      auStack_48 = (undefined1  [8])(ulong)uVar42;
      uVar15 = (uint)ppNVar50;
      uStack_60 = (code *)hasbits;
      if (auStack_48 == (undefined1  [8])0xc0) {
        uStack_58 = (LogMessageData *)ctx;
        if (uVar55 == 0x200) {
          ppNVar50 = (NodeBase **)(-(ulong)(uVar15 & 1) ^ (ulong)ppNVar50 >> 1);
        }
      }
      else {
        uStack_58 = (LogMessageData *)ctx;
        if (uVar42 == 0x80) {
          if ((uVar13 >> 10 & 1) == 0) {
            if (uVar55 == 0x200) {
              ppNVar50 = (NodeBase **)
                         (long)(int)(-(uVar15 & 1) ^ (uint)((ulong)ppNVar50 >> 1) & 0x7fffffff);
            }
          }
          else {
            puVar4 = *(uint32_t **)
                      ((long)&table->has_bits_offset +
                      (ulong)pFVar17->aux_idx * 8 + (ulong)table->aux_offset);
            if (uVar55 == 0x600) {
              if (((int)uVar15 < (int)puVar4) || ((int)((ulong)puVar4 >> 0x20) < (int)uVar15)) {
LAB_0020c1bd:
                pcVar18 = MpUnknownEnumFallback
                                    (msg,(char *)_Var43._M_head_impl,(ParseContext *)uStack_58,
                                     (TcFieldData)data_00,table,(uint64_t)uStack_60);
                return pcVar18;
              }
            }
            else {
              uStack_50 = (code *)((ulong)CONCAT24(uVar13,(undefined4)uStack_50) & 0x1c0ffffffff);
              aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c1a2;
              ppNStack_68 = ppNVar50;
              bVar11 = ValidateEnum(uVar15,puVar4);
              ppNVar50 = ppNStack_68;
              uVar42 = uStack_50._4_4_;
              if (!bVar11) goto LAB_0020c1bd;
            }
          }
        }
      }
      ppNStack_68 = ppNVar50;
      if (uVar16 == 0x30) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c0a8;
        ChangeOneof(table,pFVar17,(uint)((ulong)data_00 >> 3) & 0x1fffffff,pPVar35,msg);
      }
      else if (uVar16 == 0x10) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar17->has_idx >> 5) * 4)
        ;
        if (((ulong)puVar28 & 3) != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c258;
          AlignFail();
        }
        *puVar28 = *puVar28 | 1 << ((byte)pFVar17->has_idx & 0x1f);
      }
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c0b8;
      pvVar26 = MaybeGetSplitBase(msg,true,table);
      if (uVar42 == 0xc0) {
        puVar46 = (undefined8 *)((long)pvVar26 + (ulong)pFVar17->offset);
        if (((ulong)puVar46 & 7) != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c253;
          AlignFail(puVar46);
        }
        *puVar46 = ppNStack_68;
      }
      else if (uVar42 == 0x80) {
        puVar19 = (undefined4 *)((long)pvVar26 + (ulong)pFVar17->offset);
        if (((ulong)puVar19 & 3) != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c29f;
          AlignFail(puVar19);
        }
        *puVar19 = (int)ppNStack_68;
      }
      else {
        if (uVar42 != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c273;
          pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((long)auStack_48,0,
                               "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c28f;
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffffc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x829,pcVar30);
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c297;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffffc0);
        }
        *(bool *)((long)pvVar26 + (ulong)pFVar17->offset) = ppNStack_68 != (NodeBase **)0x0;
      }
      if ((LogMessageData *)(uStack_58->entry).full_filename_._M_len <= _Stack_70._M_head_impl) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar28 & 3) != 0) {
            aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c260;
            AlignFail(puVar28);
          }
          *puVar28 = *puVar28 | (uint)uStack_60;
        }
        return (char *)_Stack_70._M_head_impl;
      }
      uVar13 = *(ushort *)&((_Stack_70._M_head_impl)->entry).full_filename_._M_len;
      uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
      if ((uVar16 & 7) != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x20c2b7;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar40 = (ulong)(uVar16 & 0xfffffff8);
      data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
      UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
      ctx = (ParseContext *)uStack_58;
      _Var43._M_head_impl = _Stack_70._M_head_impl;
      hasbits = (uint64_t)uStack_60;
    }
    else {
      UNRECOVERED_JUMPTABLE_00 = table->fallback;
    }
    pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 10:
    uVar29 = (long)&table->has_bits_offset + uVar29;
    if ((uVar29 & 3) != 0) {
      AlignFail(uVar29);
    }
    if ((uVar42 & 7) != 2) {
      pcVar18 = MpRepeatedVarint<true>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar13 = *(ushort *)(uVar29 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar28 & 3) != 0) {
        AlignFail(puVar28);
      }
      *puVar28 = *puVar28 | uVar16;
    }
    uVar37 = uVar13 >> 6;
    uVar49 = uVar37 & 7;
    if ((uVar37 & 7) == 0) {
      pcVar18 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    if (uVar49 == 2) {
      pcVar18 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    if (uVar49 != 3) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    uVar16 = uVar13 & 0x600;
    if (((short)uVar16 != 0) && (uVar16 != 0x200)) {
      pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar16,0x200,"xform_val == +field_layout::kTvZigZag");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffe8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar30);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffe8);
    }
    pcVar18 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 0xb:
    pFVar17 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)pFVar17 & 3) != 0) {
      uStack_50._0_1_ = '\b';
      uStack_50._1_1_ = -0x3a;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      AlignFail(pFVar17);
    }
    uVar13 = pFVar17->type_card & 0x30;
    if (uVar13 == 0x20) {
      pcVar18 = MpRepeatedFixed<true>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar16 = pFVar17->type_card & 0x1c0;
    if ((ulong)uVar16 == 0xc0) {
      if ((uVar42 & 7) != 1) {
LAB_0020c527:
        UNRECOVERED_JUMPTABLE_00 = table->fallback;
        goto LAB_0020c5bc;
      }
    }
    else {
      if (uVar16 != 0x80) {
        uStack_50._0_1_ = '\x1c';
        uStack_50._1_1_ = -0x3a;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar16,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uStack_50._0_1_ = '8';
        uStack_50._1_1_ = -0x3a;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar30);
        uStack_50._0_1_ = '@';
        uStack_50._1_1_ = -0x3a;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0);
      }
      if ((uVar42 & 7) != 5) goto LAB_0020c527;
    }
    if (uVar13 == 0x30) {
      uStack_50._0_1_ = 'C';
      uStack_50._1_1_ = -0x3b;
      uStack_50._2_1_ = ' ';
      uStack_50._3_1_ = '\0';
      uStack_50._4_1_ = '\0';
      uStack_50._5_1_ = '\0';
      uStack_50._6_1_ = '\0';
      uStack_50._7_1_ = '\0';
      auStack_48 = (undefined1  [8])hasbits;
      ChangeOneof(table,pFVar17,uVar42 >> 3,(ParseContext *)(ulong)(uVar42 >> 3),msg);
    }
    else {
      auStack_48 = (undefined1  [8])hasbits;
      if (uVar13 == 0x10) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar17->has_idx >> 5) * 4)
        ;
        if (((ulong)puVar28 & 3) != 0) goto LAB_0020c640;
        *puVar28 = *puVar28 | 1 << ((byte)pFVar17->has_idx & 0x1f);
      }
    }
    uStack_50 = (code *)0x20c556;
    pvVar26 = MaybeGetSplitBase(msg,true,table);
    puVar46 = (undefined8 *)((ulong)pFVar17->offset + (long)pvVar26);
    if (uVar16 == 0xc0) {
      if (((ulong)puVar46 & 7) != 0) {
        uStack_50._0_1_ = 'J';
        uStack_50._1_1_ = -0x3a;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        AlignFail();
      }
      *puVar46 = (NodeBase *)((_Var43._M_head_impl)->entry).full_filename_._M_len;
      lVar54 = 8;
    }
    else {
      if (((ulong)puVar46 & 3) != 0) {
LAB_0020c640:
        uStack_50._0_1_ = 'E';
        uStack_50._1_1_ = -0x3a;
        uStack_50._2_1_ = ' ';
        uStack_50._3_1_ = '\0';
        uStack_50._4_1_ = '\0';
        uStack_50._5_1_ = '\0';
        uStack_50._6_1_ = '\0';
        uStack_50._7_1_ = '\0';
        AlignFail();
      }
      *(undefined4 *)puVar46 = *(undefined4 *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      lVar54 = 4;
    }
    _Var43._M_head_impl =
         (LogMessageData *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + lVar54);
    if ((LogMessageData *)(ctx->super_EpsCopyInputStream).limit_end_ <= _Var43._M_head_impl) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar28 & 3) != 0) {
          uStack_50._0_1_ = 'R';
          uStack_50._1_1_ = -0x3a;
          uStack_50._2_1_ = ' ';
          uStack_50._3_1_ = '\0';
          uStack_50._4_1_ = '\0';
          uStack_50._5_1_ = '\0';
          uStack_50._6_1_ = '\0';
          uStack_50._7_1_ = '\0';
          AlignFail(puVar28);
        }
        *puVar28 = *puVar28 | auStack_48._0_4_;
      }
      return (char *)_Var43._M_head_impl;
    }
    uVar13 = *(ushort *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
    if ((uVar16 & 7) != 0) {
      uStack_50 = MpPackedFixed<true>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar16 & 0xfffffff8);
    data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
    UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
    hasbits = (uint64_t)auStack_48;
LAB_0020c5bc:
    pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 0xc:
    puVar28 = (uint *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)puVar28 & 3) != 0) {
      uStack_60 = (code *)0x20c86f;
      AlignFail(puVar28);
    }
    if ((uVar42 & 7) != 2) {
      pcVar18 = MpRepeatedFixed<true>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar13 = *(ushort *)((long)puVar28 + 10);
    uStack_60 = (code *)0x20c6be;
    uStack_50 = (code *)ctx;
    auStack_48 = (undefined1  [8])hasbits;
    pvVar26 = MaybeGetSplitBase(msg,true,table);
    bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    if ((char)bVar12 < '\0') {
      uStack_60 = (code *)0x20c6f5;
      pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
      auVar7 = pVar58._0_12_;
    }
    else {
      auVar7[8] = bVar12;
      auVar7._0_8_ = (undefined1 *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1)
      ;
      auVar7._9_3_ = 0;
    }
    iVar38 = auVar7._8_4_;
    pcVar18 = auVar7._0_8_;
    uVar16 = uVar13 & 0x1c0;
    if ((ulong)uVar16 == 0xc0) {
      paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)pvVar26 + (ulong)*puVar28);
      if (((ulong)paVar39 & 7) != 0) {
LAB_0020c86f:
        uStack_60 = (code *)0x20c877;
        AlignFail(paVar39);
      }
      aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)paVar39->data;
      if ((undefined1 *)aVar20.data == kZeroBuffer) {
        _Var43._M_head_impl = (LogMessageData *)(msg->_internal_metadata_).ptr_;
        if (((ulong)_Var43._M_head_impl & 1) != 0) {
          _Var43._M_head_impl =
               *(LogMessageData **)((ulong)_Var43._M_head_impl & 0xfffffffffffffffe);
        }
        uStack_58 = (LogMessageData *)CONCAT44(iVar38,(undefined4)uStack_58);
        if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )_Var43._M_head_impl ==
            (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
            0x0) {
          uStack_60 = (code *)0x20c8e7;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          uStack_60 = (code *)0x20c8f4;
          RepeatedField<unsigned_long>::RepeatedField
                    ((RepeatedField<unsigned_long> *)aVar20,(Arena *)0x0);
        }
        else {
          uStack_60 = (code *)0x20c74b;
          pvVar26 = Arena::Allocate((Arena *)_Var43._M_head_impl,0x10);
          uStack_60 = (code *)0x20c75b;
          _EStack_40 = _Var43._M_head_impl;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                   Construct<google::protobuf::Arena*>(pvVar26,(Arena **)&stack0xffffffffffffffc0);
        }
        *paVar39 = aVar20;
        iVar38 = (int)((ulong)uStack_58 >> 0x20);
      }
      pPVar35 = (ParseContext *)uStack_50;
      uStack_60 = (code *)0x20c778;
      puVar21 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          ((EpsCopyInputStream *)uStack_50,pcVar18,iVar38,
                           (RepeatedField<unsigned_long> *)aVar20);
      ctx_00 = extraout_RDX_07;
    }
    else {
      if (uVar16 != 0x80) {
        uStack_60 = (code *)0x20c8a4;
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar16,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uStack_60 = (code *)0x20c8c0;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar30);
        uStack_60 = (code *)0x20c8c8;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffc0);
      }
      paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)pvVar26 + (ulong)*puVar28);
      if (((ulong)paVar39 & 7) != 0) goto LAB_0020c86f;
      aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)paVar39->data;
      if ((undefined1 *)aVar20.data == kZeroBuffer) {
        _Var43._M_head_impl = (LogMessageData *)(msg->_internal_metadata_).ptr_;
        if (((ulong)_Var43._M_head_impl & 1) != 0) {
          _Var43._M_head_impl =
               *(LogMessageData **)((ulong)_Var43._M_head_impl & 0xfffffffffffffffe);
        }
        uStack_58 = (LogMessageData *)CONCAT44(iVar38,(undefined4)uStack_58);
        if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )_Var43._M_head_impl ==
            (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
            0x0) {
          uStack_60 = (code *)0x20c910;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          uStack_60 = (code *)0x20c91d;
          RepeatedField<unsigned_int>::RepeatedField
                    ((RepeatedField<unsigned_int> *)aVar20,(Arena *)0x0);
        }
        else {
          uStack_60 = (code *)0x20c7ca;
          pvVar26 = Arena::Allocate((Arena *)_Var43._M_head_impl,0x10);
          uStack_60 = (code *)0x20c7da;
          _EStack_40 = _Var43._M_head_impl;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                   Construct<google::protobuf::Arena*>(pvVar26,(Arena **)&stack0xffffffffffffffc0);
        }
        *paVar39 = aVar20;
        iVar38 = (int)((ulong)uStack_58 >> 0x20);
      }
      pPVar35 = (ParseContext *)uStack_50;
      uStack_60 = (code *)0x20c7f7;
      puVar21 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          ((EpsCopyInputStream *)uStack_50,pcVar18,iVar38,
                           (RepeatedField<unsigned_int> *)aVar20);
      ctx_00 = extraout_RDX_08;
    }
    if (puVar21 == (ushort *)0x0) {
      pcVar18 = Error(msg,pcVar18,ctx_00,(TcFieldData)aVar20,table,(uint64_t)auStack_48);
      return pcVar18;
    }
    if ((pPVar35->super_EpsCopyInputStream).limit_end_ <= puVar21) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar28 & 3) != 0) {
          uStack_60 = (code *)0x20c8d0;
          AlignFail(puVar28);
        }
        *puVar28 = *puVar28 | auStack_48._0_4_;
      }
      return (char *)puVar21;
    }
    uVar16 = (uint)table->fast_idx_mask & (uint)*puVar21;
    if ((uVar16 & 7) != 0) {
      uStack_60 = (code *)&LAB_0020c93a;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar16 & 0xfffffff8);
    pcVar18 = (char *)(**(code **)(&table[1].has_bits_offset + uVar40))
                                (msg,puVar21,pPVar35,
                                 (ulong)*puVar21 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2),
                                 table);
    return pcVar18;
  case 0xd:
    aVar20.data = (long)&table->has_bits_offset + uVar29;
    if ((aVar20.data & 3) != 0) {
      uStack_60 = (code *)0x20cd7d;
      AlignFail(aVar20.data);
    }
    if ((uVar42 & 7) != 2) {
      UNRECOVERED_JUMPTABLE_00 = table->fallback;
      goto LAB_0020c9c3;
    }
    uVar13 = *(ushort *)(aVar20.data + 10);
    uVar37 = uVar13 & 0x30;
    if (uVar37 == 0x20) {
      pcVar18 = MpRepeatedString<true>
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    _EStack_40 = (LogMessageData *)hasbits;
    if (uVar37 == 0x10) {
      uVar16 = *(uint *)(aVar20.data + 4);
      data_00._4_4_ = 0;
      data_00._0_4_ = uVar16;
      puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar16 >> 5) * 4);
      if (((ulong)puVar28 & 3) != 0) {
        uStack_60 = (code *)0x20cd8a;
        uStack_50 = (code *)ctx;
        AlignFail();
      }
      *puVar28 = *puVar28 | 1 << ((byte)uVar16 & 0x1f);
LAB_0020ca28:
      uStack_58 = (LogMessageData *)((ulong)uStack_58 & 0xffffffff00000000);
      uStack_50 = (code *)ctx;
    }
    else {
      if (uVar37 != 0x30) goto LAB_0020ca28;
      data_00._0_4_ = uVar42 >> 3;
      data_00._4_4_ = 0;
      uStack_60 = (code *)0x20ca20;
      uStack_50 = (code *)ctx;
      bVar11 = ChangeOneof(table,(FieldEntry *)aVar20,data_00._0_4_,(ParseContext *)data_00,msg);
      uStack_58 = (LogMessageData *)CONCAT44(uStack_58._4_4_,(int)CONCAT71(extraout_var_00,bVar11));
    }
    uVar47 = (uint16_t)hasbits;
    auStack_48 = (undefined1  [8])((ulong)CONCAT24(uVar13,auStack_48._0_4_) & 0x600ffffffff);
    uStack_60 = (code *)0x20ca52;
    pvVar26 = MaybeGetSplitBase(msg,true,table);
    hasbits = (uint64_t)_EStack_40;
    ctx = (ParseContext *)uStack_50;
    if ((uVar13 & 0x1c0) == 0x140) {
      aVar22.data = (long)pvVar26 + (ulong)*(uint *)aVar20;
      if ((aVar22.data & 7) != 0) {
LAB_0020cd7d:
        uStack_60 = (code *)0x20cd85;
        AlignFail(aVar22.data);
      }
      if ((char)uStack_58 != '\0') {
        *(void **)aVar22 = (void *)0x0;
      }
      pLVar27 = (LogMessageData *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pLVar27 & 1) != 0) {
        pLVar27 = *(LogMessageData **)((ulong)pLVar27 & 0xfffffffffffffffe);
      }
      bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      uVar16 = (uint)bVar12;
      if ((char)bVar12 < '\0') {
        uStack_60 = (code *)0x20cba1;
        _Stack_38._M_head_impl = (LogMessageData *)msg;
        pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,uVar16);
        pcVar18 = pVar58.first;
        if (pcVar18 != (char *)0x0) {
          uVar16 = pVar58.second;
          goto LAB_0020cbb4;
        }
        _Var43._M_head_impl = (LogMessageData *)0x0;
      }
      else {
        pcVar18 = (char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
        _Stack_38._M_head_impl = (LogMessageData *)msg;
LAB_0020cbb4:
        pLVar36 = (LogMessageData *)uStack_50;
        uStack_60 = (code *)0x20cbc4;
        uStack_58 = pLVar27;
        iVar38 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)uStack_50,pcVar18);
        if (iVar38 < (int)uVar16) {
          uStack_60 = (code *)0x20cbde;
          _Var43._M_head_impl =
               (LogMessageData *)
               EpsCopyInputStream::ReadMicroStringFallback
                         (pLVar36,pcVar18,uVar16,(MicroString *)aVar22,uStack_58);
        }
        else {
          uStack_60 = (code *)0x20cc04;
          sVar57._M_str = pcVar18;
          sVar57._M_len = (long)(int)uVar16;
          MicroString::SetImpl((MicroString *)aVar22,sVar57,(Arena *)uStack_58,7);
          _Var43._M_head_impl = (LogMessageData *)(pcVar18 + (int)uVar16);
        }
      }
      uStack_60 = (code *)0x20ccdc;
      sVar57 = MicroString::Get((MicroString *)aVar22);
      table_00.data = (uint64_t)sVar57._M_str;
      uStack_60 = (code *)0x20ccf3;
      wire_bytes_01._M_str = (char *)table;
      wire_bytes_01._M_len = table_00.data;
      bVar11 = MpVerifyUtf8((TcParser *)sVar57._M_len,wire_bytes_01,(TcParseTableBase *)aVar20,
                            (FieldEntry *)((ulong)auStack_48 >> 0x20 & 0xffff),uVar47);
      pPVar35 = extraout_RDX_11;
      hasbits = (uint64_t)_EStack_40;
      ctx = (ParseContext *)uStack_50;
      msg = (MessageLite *)_Stack_38._M_head_impl;
    }
    else if ((uVar13 & 0x1c0) == 0x80) {
      if (uVar37 == 0x30) {
        if ((char)uStack_58 == '\0') {
          paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar20);
          if (((ulong)paVar39 & 7) != 0) goto LAB_0020cdd6;
          aVar22 = *paVar39;
        }
        else {
          pAVar44 = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar44 & 1) != 0) {
            pAVar44 = *(Arena **)((ulong)pAVar44 & 0xfffffffffffffffe);
          }
          if (pAVar44 == (Arena *)0x0) {
            uStack_60 = (code *)0x20cdf1;
            aVar22 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          }
          else {
            data_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
            uStack_60 = (code *)0x20cb13;
            aVar22 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     Arena::AllocateAlignedWithCleanup
                               (pAVar44,0x10,8,
                                cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
          }
          *(undefined8 *)aVar22 = 0;
          *(undefined8 *)(aVar22.data + 8) = 0;
          paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar20);
          if (((ulong)paVar39 & 7) != 0) {
LAB_0020cdd6:
            uStack_60 = (code *)0x20cddb;
            AlignFail();
          }
          paVar39->data = (uint64_t)aVar22;
        }
      }
      else {
        data_00._4_4_ = 0;
        data_00._0_4_ = *(uint *)aVar20;
        aVar22.data = (long)pvVar26 + (long)data_00;
        if ((aVar22.data & 7) != 0) goto LAB_0020cd7d;
      }
      bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      if ((char)bVar12 < '\0') {
        table_00.data._4_4_ = 0;
        table_00.data._0_4_ = CONCAT31(0,bVar12);
        uStack_60 = (code *)0x20cc9a;
        pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,CONCAT31(0,bVar12));
        auVar8 = pVar58._0_12_;
        pPVar35 = pVar58._8_8_;
        if (pVar58.first == (char *)0x0) goto LAB_0020cdb2;
      }
      else {
        auVar8[8] = bVar12;
        auVar8._0_8_ = (undefined1 *)
                       ((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
        auVar8._9_3_ = 0;
      }
      table_00.data = auVar8._0_8_;
      uStack_60 = (code *)0x20ccb7;
      pLVar27 = (LogMessageData *)ctx;
      _Var43._M_head_impl =
           (LogMessageData *)
           EpsCopyInputStream::ReadCord
                     (&ctx->super_EpsCopyInputStream,(char *)table_00,auVar8._8_4_,(Cord *)aVar22);
      data_00 = (code *)aVar22;
      pPVar35 = entry_01;
      if (_Var43._M_head_impl == (LogMessageData *)0x0) goto LAB_0020cdb2;
      aVar20.data._2_6_ = 0;
      aVar20.data._0_2_ = auStack_48._4_2_;
      uStack_60 = (code *)0x20cccd;
      MpVerifyUtf8((Cord *)pLVar27,(TcParseTableBase *)table_00,(FieldEntry *)entry_01,
                   auStack_48._4_2_);
      bVar11 = true;
      pPVar35 = extraout_RDX_10;
    }
    else {
      if ((uVar13 & 0x1c0) != 0) {
        uStack_60 = (code *)&UNK_0020ce1f;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aVar22.data = (long)pvVar26 + (ulong)*(uint *)aVar20;
      if ((aVar22.data & 7) != 0) goto LAB_0020cd7d;
      if ((char)uStack_58 != '\0') {
        *(undefined8 **)aVar22 = &fixed_address_empty_string;
      }
      data_00 = (code *)(msg->_internal_metadata_).ptr_;
      if (((ulong)data_00 & 1) != 0) {
        data_00 = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                          ((ulong)data_00 & 0xfffffffffffffffe))->data;
      }
      if (data_00 == (code *)0x0) {
        uStack_60 = (code *)0x20cc1c;
        psVar23 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)aVar22,(Arena *)0x0);
        uStack_60 = (code *)0x20cc2a;
        _Var43._M_head_impl =
             (LogMessageData *)InlineGreedyStringParser(psVar23,_Var43._M_head_impl,ctx);
      }
      else {
        uStack_60 = (code *)0x20cabf;
        _Var43._M_head_impl =
             (LogMessageData *)
             EpsCopyInputStream::ReadArenaString
                       ((EpsCopyInputStream *)uStack_50,_Var43._M_head_impl,(ArenaStringPtr *)aVar22
                        ,(Arena *)data_00);
      }
      if (_Var43._M_head_impl == (LogMessageData *)0x0) {
        uStack_60 = (code *)0x20cdad;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)aVar22);
        pPVar35 = extraout_RDX_12;
        hasbits = (uint64_t)_EStack_40;
        table_00 = aVar22;
        goto LAB_0020cdb2;
      }
      table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                 ((ulong)*(void **)aVar22 & 0xfffffffffffffffc))->data;
      uStack_60 = (code *)0x20cc55;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = table_00.data;
      bVar11 = MpVerifyUtf8((TcParser *)
                            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                            ((ulong)*(void **)aVar22 & 0xfffffffffffffffc))[1],wire_bytes_00,
                            (TcParseTableBase *)aVar20,
                            (FieldEntry *)((ulong)auStack_48 >> 0x20 & 0xffff),uVar47);
      pPVar35 = extraout_RDX_09;
      hasbits = (uint64_t)_EStack_40;
    }
    data_00 = (code *)aVar20;
    if ((bVar11 != false) && (_Var43._M_head_impl != (LogMessageData *)0x0)) {
      if ((LogMessageData *)(((LogMessageData *)ctx)->entry).full_filename_._M_len <=
          _Var43._M_head_impl) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar28 = (uint *)((long)msg + (ulong)table->has_bits_offset);
          if (((ulong)puVar28 & 3) != 0) {
            uStack_60 = (code *)0x20cdd6;
            AlignFail(puVar28);
          }
          *puVar28 = *puVar28 | (uint)hasbits;
        }
        return (char *)_Var43._M_head_impl;
      }
      uVar13 = *(ushort *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
      if ((uVar16 & 7) != 0) {
        uStack_60 = (code *)0x20ce0e;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar40 = (ulong)(uVar16 & 0xfffffff8);
      data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
      UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
LAB_0020c9c3:
      pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                          (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
LAB_0020cdb2:
    pcVar18 = Error(msg,(char *)table_00,pPVar35,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  case 0xe:
    pFVar53 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    pFVar17 = pFVar53;
    if (((ulong)pFVar53 & 3) != 0) {
LAB_0020d176:
      _Stack_70._M_head_impl = (LogMessageData *)0x20d17b;
      AlignFail(pFVar17);
    }
    uVar13 = pFVar53->type_card;
    uVar37 = uVar13 & 0x30;
    if (uVar37 == 0x20) {
      if ((uVar13 & 0x1c0) == 0x40) {
        pcVar18 = MpRepeatedMessageOrGroup<true,true>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      }
      if ((uVar13 & 0x1c0) == 0) {
        pcVar18 = MpRepeatedMessageOrGroup<true,false>
                            (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits)
        ;
        return pcVar18;
      }
LAB_0020cf1a:
      pcVar18 = (*table->fallback)(msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,
                                   hasbits);
      return pcVar18;
    }
    uVar55 = uVar42 & 7;
    if ((uVar13 & 0x1c0) == 0x40) {
      if (uVar55 != 3) goto LAB_0020cf1a;
    }
    else if (((uVar13 & 0x1c0) != 0) || (uVar55 != 2)) goto LAB_0020cf1a;
    uStack_50 = (code *)msg;
    auStack_48 = (undefined1  [8])_Var43._M_head_impl;
    if (uVar37 == 0x30) {
      _Stack_70._M_head_impl = (LogMessageData *)0x20cf50;
      uStack_58 = (LogMessageData *)ctx;
      bVar11 = ChangeOneof(table,pFVar53,(uint32_t)(uVar32 >> 3),(ParseContext *)(ulong)uVar55,msg);
      uStack_60 = (code *)CONCAT44((int)CONCAT71(extraout_var_01,bVar11),(int)uStack_60);
    }
    else {
      if (uVar37 == 0x10) {
        pFVar17 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar53->has_idx >> 5) * 4);
        uStack_58 = (LogMessageData *)ctx;
        if (((ulong)pFVar17 & 3) != 0) goto LAB_0020d176;
        pFVar17->offset = pFVar17->offset | 1 << ((byte)pFVar53->has_idx & 0x1f);
      }
      uStack_60 = (code *)((ulong)uStack_60 & 0xffffffff);
      uStack_58 = (LogMessageData *)ctx;
    }
    _Stack_70._M_head_impl = (LogMessageData *)0x20cf69;
    pvVar26 = MaybeGetSplitBase((MessageLite *)uStack_50,true,table);
    if ((ulong)table->has_bits_offset != 0) {
      pFVar17 = (FieldEntry *)
                ((long)&(((LogMessageData *)uStack_50)->entry).full_filename_._M_len +
                (ulong)table->has_bits_offset);
      if (((ulong)pFVar17 & 3) != 0) goto LAB_0020d176;
      pFVar17->offset = pFVar17->offset | uVar16;
    }
    plVar48 = (long *)((long)pvVar26 + (ulong)pFVar53->offset);
    if (((ulong)plVar48 & 7) != 0) {
      _Stack_70._M_head_impl = (LogMessageData *)0x20d183;
      AlignFail(plVar48);
    }
    pTVar25 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar53->aux_idx * 8 + (ulong)table->aux_offset);
    uVar37 = uVar13 >> 9 & 3;
    if (uVar37 != 2) {
      if ((uVar13 >> 9 & 3) == 0) {
        pcVar45 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar18 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar38 = 0x9c8;
        goto LAB_0020d226;
      }
      if (uVar37 != 1) {
        pTVar25 = *(TcParseTableBase **)pTVar25;
      }
      _Stack_70._M_head_impl = (LogMessageData *)0x20d19b;
      pTVar25 = MessageLite::GetTcParseTable((MessageLite *)pTVar25);
    }
    if ((byte)((byte)((ulong)uStack_60 >> 0x20) | *plVar48 == 0) == 1) {
      pAVar44 = (Arena *)(((LogMessageData *)uStack_50)->entry).full_filename_._M_str;
      if (((ulong)pAVar44 & 1) != 0) {
        pAVar44 = *(Arena **)((ulong)pAVar44 & 0xfffffffffffffffe);
      }
      _Stack_70._M_head_impl = (LogMessageData *)0x20cff1;
      pMVar24 = ClassData::New(pTVar25->class_data,pAVar44);
      *plVar48 = (long)pMVar24;
    }
    pLVar27 = uStack_58;
    if ((uVar13 & 0x1c0) == 0x40) {
      iVar38 = (int)(uStack_58->entry).encoding_._M_len;
      uVar16 = iVar38 - 1;
      *(uint *)&(uStack_58->entry).encoding_._M_len = uVar16;
      if (iVar38 < 1) {
        return (char *)0x0;
      }
      iVar51 = *(int *)((long)&(uStack_58->entry).encoding_._M_len + 4);
      iVar52 = (int)((long)iVar51 + 1);
      *(int *)((long)&(uStack_58->entry).encoding_._M_len + 4) = iVar52;
      _Stack_70._M_head_impl = (LogMessageData *)0x20d037;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar48,(char *)auStack_48,(ParseContext *)uStack_58,
                           pTVar25);
      if (pcVar18 == (char *)0x0) {
        iVar51 = *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4) + -1;
        iVar38 = (int)(pLVar27->entry).encoding_._M_len + 1;
LAB_0020d14a:
        *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4) = iVar51;
        *(int *)&(pLVar27->entry).encoding_._M_len = iVar38;
        sVar9 = (pLVar27->entry).prefix_len_;
        *(uint32_t *)&(pLVar27->entry).prefix_len_ = 0;
        if ((uint)sVar9 == uVar42) {
          return pcVar18;
        }
        return (char *)0x0;
      }
      uVar55 = (uint)(pLVar27->entry).encoding_._M_len;
      if (uVar16 == uVar55) {
        iVar2 = *(int *)((long)&(pLVar27->entry).encoding_._M_len + 4);
        if (iVar52 == iVar2) goto LAB_0020d14a;
        _Stack_70._M_head_impl = (LogMessageData *)0x20d06b;
        pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar51 + 1,(long)iVar2,"old_group_depth == group_depth_");
        iVar38 = 0x492;
      }
      else {
        _Stack_70._M_head_impl = (LogMessageData *)0x20d1e7;
        pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar16,(long)(int)uVar55,"old_depth == depth_");
        iVar38 = 0x491;
      }
    }
    else {
      bVar12 = *(byte *)&(((LogEntry *)auStack_48)->full_filename_)._M_len;
      if ((char)bVar12 < '\0') {
        _Stack_70._M_head_impl = (LogMessageData *)0x20d09e;
        pVar58 = ReadSizeFallback((char *)auStack_48,(uint)bVar12);
        pcVar18 = pVar58.first;
        if (pcVar18 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pcVar18 = (char *)((long)&(((LogEntry *)auStack_48)->full_filename_)._M_len + 1);
      }
      if ((int)(uStack_58->entry).encoding_._M_len < 1) {
        return (char *)0x0;
      }
      _Stack_70._M_head_impl = (LogMessageData *)0x20d0d3;
      EpsCopyInputStream::PushLimit
                ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)uStack_58,(int)pcVar18);
      EVar10.saved_errno_ = EStack_40.saved_errno_;
      lVar54 = (long)(int)(uStack_58->entry).encoding_._M_len + -1;
      iVar51 = (int)lVar54;
      *(int *)&(uStack_58->entry).encoding_._M_len = iVar51;
      _Stack_70._M_head_impl = (LogMessageData *)0x20d0ff;
      pcVar18 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar48,pcVar18,(ParseContext *)uStack_58,pTVar25);
      iVar38 = (int)(uStack_58->entry).encoding_._M_len;
      if ((pcVar18 == (char *)0x0) || (iVar51 == iVar38)) {
        *(int *)&(uStack_58->entry).encoding_._M_len = iVar38 + 1;
        uVar16 = EVar10.saved_errno_ + *(int *)((long)&(uStack_58->entry).base_filename_._M_str + 4)
        ;
        *(uint *)((long)&(uStack_58->entry).base_filename_._M_str + 4) = uVar16;
        if ((uint32_t)(uStack_58->entry).prefix_len_ != 0) {
          return (char *)0x0;
        }
        (uStack_58->entry).full_filename_._M_len =
             (size_t)((uStack_58->entry).full_filename_._M_str + (int)((int)uVar16 >> 0x1f & uVar16)
                     );
        return pcVar18;
      }
      _Stack_70._M_head_impl = (LogMessageData *)0x20d20f;
      pcVar18 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (lVar54,(long)iVar38,"old_depth == depth_");
      iVar38 = 0x481;
    }
    pcVar45 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_0020d226:
    _Stack_70._M_head_impl = (LogMessageData *)0x20d22b;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffc0,pcVar45,iVar38,pcVar18);
    _Stack_70._M_head_impl = (LogMessageData *)&UNK_0020d233;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffc0);
  case 0xf:
    pFVar17 = (FieldEntry *)((long)&table->has_bits_offset + uVar29);
    if (((ulong)pFVar17 & 3) != 0) {
      AlignFail(pFVar17);
    }
    aStack_80.data =
         (long)&table->has_bits_offset + (ulong)pFVar17->aux_idx * 8 + (ulong)table->aux_offset;
    bStack_a1 = *(byte *)(aStack_80.data + 4);
    if (((bStack_a1 & 1) == 0) || ((uVar42 & 7) != 2)) {
      pcVar18 = MpFallback(msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar18;
    }
    uVar40 = (ulong)*(uint *)((long)&table->has_bits_offset +
                             (ulong)pFVar17->aux_idx * 8 + (ulong)table->aux_offset);
    pvVar26 = MaybeGetSplitBase(msg,true,table);
    this._M_head_impl = (LogMessageData *)((ulong)pFVar17->offset + (long)pvVar26);
    uStack_50 = (code *)pFVar17;
    if ((bStack_a1 & 2) == 0) {
      if (((ulong)this._M_head_impl & 7) != 0) {
LAB_0020d752:
        AlignFail(this._M_head_impl);
      }
      pLVar27 = _Var43._M_head_impl;
      if (((ulong)((this._M_head_impl)->entry).full_filename_._M_len & 1) != 0) {
LAB_0020d75a:
        (*MapFieldBaseForParse::sync_map_with_repeated)(this._M_head_impl,1);
      }
      this._M_head_impl = (LogMessageData *)&((this._M_head_impl)->entry).base_filename_;
      _Var43._M_head_impl = pLVar27;
    }
    else if (((ulong)this._M_head_impl & 7) != 0) goto LAB_0020d752;
    uStack_58 = (LogMessageData *)(uVar40 & 0xffffffff | (ulong)bStack_a1 << 0x20);
    goto LAB_0020d2fe;
  }
  aVar22.data = (long)&table->has_bits_offset + uVar29;
  aVar20.data = aVar22.data;
  if ((aVar22.data & 3) != 0) {
LAB_0020b539:
    uStack_60 = (code *)0x20b53e;
    AlignFail(aVar20.data);
  }
  if ((uVar42 & 7) != 2) {
    UNRECOVERED_JUMPTABLE_00 = table->fallback;
    goto LAB_0020b1e4;
  }
  uVar13 = *(ushort *)(aVar22.data + 10);
  uVar37 = uVar13 & 0x30;
  if (uVar37 == 0x20) {
    pcVar18 = MpRepeatedString<false>
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  }
  uStack_50 = (code *)hasbits;
  if (uVar37 == 0x10) {
    uVar16 = *(uint *)(aVar22.data + 4);
    data_00._4_4_ = 0;
    data_00._0_4_ = uVar16;
    aVar20.data = (long)&msg->_vptr_MessageLite + (ulong)(uVar16 >> 5) * 4;
    uStack_58 = (LogMessageData *)ctx;
    if ((aVar20.data & 3) != 0) goto LAB_0020b539;
    *(uint *)aVar20 = *(uint *)aVar20 | 1 << ((byte)uVar16 & 0x1f);
LAB_0020b24c:
    bVar11 = false;
    uStack_58 = (LogMessageData *)ctx;
  }
  else {
    if (uVar37 != 0x30) goto LAB_0020b24c;
    data_00._0_4_ = uVar42 >> 3;
    data_00._4_4_ = 0;
    uStack_60 = (code *)0x20b246;
    uStack_58 = (LogMessageData *)ctx;
    bVar11 = ChangeOneof(table,(FieldEntry *)aVar22,data_00._0_4_,(ParseContext *)data_00,msg);
  }
  uVar47 = (uint16_t)hasbits;
  entry._0_4_ = uVar13 & 0x600;
  entry.data._4_4_ = 0;
  if ((uVar13 & 0x1c0) == 0x140) {
    this_00 = (undefined1  [8])((long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar22);
    if (((ulong)this_00 & 7) != 0) {
      uStack_60 = (code *)0x20b54e;
      AlignFail(this_00);
    }
    if (bVar11 != false) {
      (((LogMessageData *)this_00)->entry).full_filename_._M_len = 0;
    }
    _Stack_38._M_head_impl = (LogMessageData *)(msg->_internal_metadata_).ptr_;
    if (((ulong)_Stack_38._M_head_impl & 1) != 0) {
      _Stack_38._M_head_impl =
           *(LogMessageData **)((ulong)_Stack_38._M_head_impl & 0xfffffffffffffffe);
    }
    _EStack_40 = (LogMessageData *)((ulong)CONCAT24(uVar13,EStack_40.saved_errno_) & 0x600ffffffff);
    bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    uVar16 = (uint)bVar12;
    if ((char)bVar12 < '\0') {
      uStack_60 = (code *)0x20b38f;
      pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
      pcVar18 = pVar58.first;
      if (pcVar18 != (char *)0x0) {
        uVar16 = pVar58.second;
        goto LAB_0020b3a6;
      }
      _Var43._M_head_impl = (LogMessageData *)0x0;
    }
    else {
      pcVar18 = (char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
LAB_0020b3a6:
      pLVar27 = uStack_58;
      uStack_60 = (code *)0x20b3b4;
      auStack_48 = this_00;
      iVar38 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)uStack_58,pcVar18);
      this_00 = auStack_48;
      if (iVar38 < (int)uVar16) {
        uStack_60 = (code *)0x20b3d2;
        _Var43._M_head_impl =
             (LogMessageData *)
             EpsCopyInputStream::ReadMicroStringFallback
                       (pLVar27,pcVar18,uVar16,(MicroString *)auStack_48,_Stack_38._M_head_impl);
      }
      else {
        uStack_60 = (code *)0x20b3fb;
        data_02._M_str = pcVar18;
        data_02._M_len = (long)(int)uVar16;
        MicroString::SetImpl((MicroString *)auStack_48,data_02,(Arena *)_Stack_38._M_head_impl,7);
        _Var43._M_head_impl = (LogMessageData *)(pcVar18 + (int)uVar16);
      }
    }
    uStack_60 = (code *)0x20b4b3;
    sVar56 = MicroString::Get((MicroString *)this_00);
    entry.data = (ulong)_EStack_40 >> 0x20 & 0xffff;
LAB_0020b4bf:
    wire_bytes._M_len = (uint64_t)sVar56._M_str;
    uStack_60 = (code *)0x20b4ca;
    wire_bytes._M_str = (char *)table;
    bVar11 = MpVerifyUtf8((TcParser *)sVar56._M_len,wire_bytes,(TcParseTableBase *)aVar22,
                          (FieldEntry *)entry,uVar47);
    entry = aVar22;
    pPVar35 = extraout_RDX_02;
  }
  else {
    if ((uVar13 & 0x1c0) != 0x80) {
      if ((uVar13 & 0x1c0) != 0) {
        uStack_60 = MpMessage<false>;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aVar20.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar22;
      if ((aVar20.data & 7) != 0) {
LAB_0020b53e:
        uStack_60 = (code *)0x20b546;
        AlignFail(aVar20.data);
      }
      if (bVar11 != false) {
        *(undefined8 **)aVar20 = &fixed_address_empty_string;
      }
      data_00 = (code *)(msg->_internal_metadata_).ptr_;
      if (((ulong)data_00 & 1) != 0) {
        data_00 = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                          ((ulong)data_00 & 0xfffffffffffffffe))->data;
      }
      if (data_00 == (code *)0x0) {
        uStack_60 = (code *)0x20b40d;
        psVar23 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)aVar20,(Arena *)0x0);
        uStack_60 = (code *)0x20b41c;
        _Var43._M_head_impl =
             (LogMessageData *)InlineGreedyStringParser(psVar23,_Var43._M_head_impl,uStack_58);
      }
      else {
        uStack_60 = (code *)0x20b2c1;
        _Var43._M_head_impl =
             (LogMessageData *)
             EpsCopyInputStream::ReadArenaString
                       (uStack_58,_Var43._M_head_impl,(ArenaStringPtr *)aVar20,(Arena *)data_00);
      }
      if (_Var43._M_head_impl == (LogMessageData *)0x0) {
        uStack_60 = (code *)0x20b571;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)aVar20);
        pPVar35 = extraout_RDX_03;
        wire_bytes._M_len = aVar20;
        goto LAB_0020b576;
      }
      sVar56._M_str = *(char **)(*(ulong *)aVar20 & 0xfffffffffffffffc);
      sVar56._M_len = ((undefined8 *)(*(ulong *)aVar20 & 0xfffffffffffffffc))[1];
      goto LAB_0020b4bf;
    }
    if (uVar37 == 0x30) {
      if (bVar11 == false) {
        paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar22);
        if (((ulong)paVar39 & 7) != 0) goto LAB_0020b597;
        aVar20 = *paVar39;
      }
      else {
        pAVar44 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar44 & 1) != 0) {
          pAVar44 = *(Arena **)((ulong)pAVar44 & 0xfffffffffffffffe);
        }
        if (pAVar44 == (Arena *)0x0) {
          uStack_60 = (code *)0x20b5b2;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          data_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          uStack_60 = (code *)0x20b308;
          aVar20 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   Arena::AllocateAlignedWithCleanup
                             (pAVar44,0x10,8,
                              cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
        }
        *(undefined8 *)aVar20 = 0;
        *(undefined8 *)(aVar20.data + 8) = 0;
        paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar22);
        if (((ulong)paVar39 & 7) != 0) {
LAB_0020b597:
          uStack_60 = (code *)0x20b59c;
          AlignFail();
        }
        paVar39->data = (uint64_t)aVar20;
      }
    }
    else {
      aVar20.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar22;
      if ((aVar20.data & 7) != 0) goto LAB_0020b53e;
    }
    bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    if ((char)bVar12 < '\0') {
      wire_bytes._M_len._4_4_ = 0;
      wire_bytes._M_len._0_4_ = CONCAT31(0,bVar12);
      uStack_60 = (code *)0x20b46a;
      pVar58 = ReadSizeFallback((char *)_Var43._M_head_impl,CONCAT31(0,bVar12));
      auVar6 = pVar58._0_12_;
      pPVar35 = pVar58._8_8_;
      if (pVar58.first == (char *)0x0) goto LAB_0020b576;
    }
    else {
      auVar6[8] = bVar12;
      auVar6._0_8_ = (undefined1 *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1)
      ;
      auVar6._9_3_ = 0;
    }
    wire_bytes._M_len = auVar6._0_8_;
    uStack_60 = (code *)0x20b48a;
    pLVar27 = uStack_58;
    _Var43._M_head_impl =
         (LogMessageData *)
         EpsCopyInputStream::ReadCord
                   (uStack_58,(char *)wire_bytes._M_len,auVar6._8_4_,(Cord *)aVar20);
    data_00 = (code *)aVar20;
    pPVar35 = entry_00;
    if (_Var43._M_head_impl == (LogMessageData *)0x0) goto LAB_0020b576;
    uStack_60 = (code *)0x20b4a4;
    MpVerifyUtf8((Cord *)pLVar27,(TcParseTableBase *)wire_bytes._M_len,(FieldEntry *)entry_00,
                 (uint16_t)entry._0_4_);
    bVar11 = true;
    pPVar35 = extraout_RDX_01;
  }
  data_00 = (code *)entry;
  if ((bVar11 != false) && (_Var43._M_head_impl != (LogMessageData *)0x0)) {
    if ((LogMessageData *)(uStack_58->entry).full_filename_._M_len <= _Var43._M_head_impl) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar28 & 3) != 0) {
          uStack_60 = (code *)0x20b597;
          AlignFail(puVar28);
        }
        *puVar28 = *puVar28 | (uint)uStack_50;
      }
      return (char *)_Var43._M_head_impl;
    }
    uVar13 = *(ushort *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
    uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
    if ((uVar16 & 7) != 0) {
      uStack_60 = (code *)0x20b5cf;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar16 & 0xfffffff8);
    data_00 = (code *)((ulong)uVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2));
    UNRECOVERED_JUMPTABLE_00 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
    ctx = (ParseContext *)uStack_58;
    hasbits = (uint64_t)uStack_50;
LAB_0020b1e4:
    pcVar18 = (*UNRECOVERED_JUMPTABLE_00)
                        (msg,(char *)_Var43._M_head_impl,ctx,(TcFieldData)data_00,table,hasbits);
    return pcVar18;
  }
LAB_0020b576:
  pcVar18 = Error(msg,(char *)wire_bytes._M_len,pPVar35,(TcFieldData)data_00,table,
                  (uint64_t)uStack_50);
  return pcVar18;
code_r0x0020d4bf:
  uVar15 = uVar15 & 0xf;
  data_01 = &switchD_0020d4d0::switchdataD_002c0f38;
  uVar29 = (ulong)(int)(&switchD_0020d4d0::switchdataD_002c0f38)[uVar15];
  puVar28 = (uint *)((long)&switchD_0020d4d0::switchdataD_002c0f38 + uVar29);
  bVar12 = (byte)puVar28;
  switch(uVar15) {
  case 0:
switchD_0020d4d0_caseD_0:
    node_00 = node;
    _Var43._M_head_impl = this._M_head_impl;
code_r0x0020d4d8:
    KeyMapBase<bool>::InsertOrReplaceNode
              ((KeyMapBase<bool> *)_Var43._M_head_impl,(KeyNode *)node_00);
LAB_0020d504:
    do {
      if ((LogMessageData *)(ctx->super_EpsCopyInputStream).limit_end_ <= pLVar27) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar28 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar28 & 3) != 0) {
            AlignFail();
          }
          *puVar28 = *puVar28 | uVar16;
        }
        return (char *)pLVar27;
      }
      bVar12 = *(byte *)&(pLVar27->entry).full_filename_._M_len;
      uVar55 = (uint)bVar12;
      _Var43._M_head_impl = (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 1);
      if ((char)bVar12 < '\0') {
        uVar41 = (uint7)(((ulong)bVar12 << 0x39) >> 8);
        cVar31 = *(char *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
        lVar54 = CONCAT71(uVar41,cVar31);
        if (cVar31 < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
          cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 2);
          lVar54 = CONCAT71(uVar41,cVar31);
          if (cVar31 < '\0') {
            uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
            cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 3);
            lVar54 = CONCAT71(uVar41,cVar31);
            if (cVar31 < '\0') {
              uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar54 << 0x39) >> 8);
              cVar31 = *(char *)((long)&(pLVar27->entry).full_filename_._M_len + 4);
              if (cVar31 < '\0') {
                uVar55 = 0;
                _Var43._M_head_impl = (LogMessageData *)0x0;
              }
              else {
                uVar55 = (int)CONCAT71(uVar41,cVar31) << 0x1c | (uint)(uVar41 >> 0x1c);
                _Var43._M_head_impl =
                     (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 5);
              }
            }
            else {
              uVar55 = (int)lVar54 << 0x15 | (uint)(uVar41 >> 0x23);
              _Var43._M_head_impl =
                   (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 4);
            }
          }
          else {
            uVar55 = (int)lVar54 << 0xe | (uint)(uVar41 >> 0x2a);
            _Var43._M_head_impl =
                 (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 3);
          }
        }
        else {
          uVar55 = (int)lVar54 << 7 | (uint)(((ulong)bVar12 << 0x39) >> 0x39);
          _Var43._M_head_impl =
               (LogMessageData *)((long)&(pLVar27->entry).full_filename_._M_len + 2);
        }
      }
      if (uVar55 != uVar42) {
        uVar13 = *(ushort *)&(pLVar27->entry).full_filename_._M_len;
        uVar16 = (uint)table->fast_idx_mask & (uint)uVar13;
        if ((uVar16 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar40 = (ulong)(uVar16 & 0xfffffff8);
        pcVar18 = (char *)(**(code **)(&table[1].has_bits_offset + uVar40))
                                    (msg,pLVar27,ctx,
                                     (ulong)uVar13 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2),table,hasbits)
        ;
        return pcVar18;
      }
LAB_0020d2fe:
      pLVar36 = (LogMessageData *)(ulong)*(ushort *)((long)this._M_head_impl + 0xc);
      node = (LogMessageData *)UntypedMapBase::AllocNode(this._M_head_impl,(size_t)pLVar36);
      uVar13 = *(ushort *)((long)this._M_head_impl + 0xc);
      uVar40 = (ulong)uVar13 - 8;
      if (uVar40 < 8) {
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar40,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar38 = 0xb2c;
LAB_0020d719:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&_Stack_78,pcVar18,iVar38,pcVar30);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&_Stack_78);
      }
      (node->entry).full_filename_._M_str = (char *)0x0;
      *(undefined8 *)((long)node + ((ulong)uVar13 - 8)) = 0;
      f_01.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                *)auStack_48;
      f_01.this = (UntypedMapBase *)this._M_head_impl;
      f_01.node = (NodeBase **)&uStack_60;
      _Stack_78._M_head_impl = this._M_head_impl;
      _Stack_70._M_head_impl = (LogMessageData *)auStack_48;
      ppNStack_68 = (NodeBase **)&uStack_60;
      uStack_60 = (code *)node;
      auStack_48 = (undefined1  [8])this._M_head_impl;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this._M_head_impl,f_01);
      _EStack_40 = (LogMessageData *)&aStack_80;
      f_02.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)auStack_48;
      f_02.this = (UntypedMapBase *)this._M_head_impl;
      f_02.node = (NodeBase **)&uStack_60;
      _Stack_78._M_head_impl = this._M_head_impl;
      _Stack_70._M_head_impl = (LogMessageData *)auStack_48;
      ppNStack_68 = (NodeBase **)&uStack_60;
      uStack_60 = (code *)node;
      auStack_48 = (undefined1  [8])this._M_head_impl;
      _Stack_38._M_head_impl = this._M_head_impl;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this._M_head_impl,f_02);
      bVar12 = *(byte *)&((_Var43._M_head_impl)->entry).full_filename_._M_len;
      aVar33.data._1_7_ = 0;
      aVar33.data._0_1_ = bVar12;
      if ((char)bVar12 < '\0') {
        pLVar36 = (LogMessageData *)(ulong)(uint)bVar12;
        pVar59 = ReadSizeFallback((char *)_Var43._M_head_impl,(uint)bVar12);
        pLVar34 = pVar59._8_8_;
        if (pVar59.first == (char *)0x0) goto LAB_0020d616;
        aVar33.data = (ulong)pLVar34 & 0xffffffff;
      }
      else {
        pVar59._8_8_ = extraout_RDX_13;
        pVar59.first = (char *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_len + 1);
      }
      pLVar34 = pVar59._8_8_;
      node_00 = (LogMessageData *)pVar59.first;
      if (ctx->depth_ < 1) {
LAB_0020d616:
        if (*(char **)((long)this._M_head_impl + 0x18) == (char *)0x0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)this._M_head_impl,(NodeBase *)node);
          pLVar34 = extraout_RDX_15;
          pLVar36 = node;
        }
        pcVar18 = Error(msg,(char *)pLVar36,(ParseContext *)pLVar34,(TcFieldData)aVar33,table,
                        hasbits);
        return pcVar18;
      }
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&_Stack_78,(char *)ctx,(int)pVar59.first);
      EVar10.saved_errno_ = _Stack_78._M_head_impl._0_4_;
      uVar40 = (long)ctx->depth_ - 1;
      ctx->depth_ = (int)uVar40;
      aVar33 = aStack_80;
      _Var43._M_head_impl = node;
      pTVar25 = table;
      pFVar17 = (FieldEntry *)uStack_50;
      _Var60._M_head_impl = this._M_head_impl;
      pLVar27 = (LogMessageData *)
                ParseOneMapEntry((NodeBase *)node,(char *)node_00,ctx,(FieldAux *)aStack_80,table,
                                 (FieldEntry *)uStack_50,this._M_head_impl);
      iVar38 = ctx->depth_;
      if ((pLVar27 != (LogMessageData *)0x0) && ((int)uVar40 != iVar38)) {
        pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (uVar40,(long)iVar38,"old_depth == depth_");
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar38 = 0x481;
        goto LAB_0020d719;
      }
      ctx->depth_ = iVar38 + 1;
      uVar55 = EVar10.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar55;
      pLVar34 = extraout_RDX_14;
      pLVar36 = node_00;
      if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
         ((ctx->super_EpsCopyInputStream).limit_end_ =
               (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar55 >> 0x1f & uVar55),
         pLVar27 == (LogMessageData *)0x0)) goto LAB_0020d616;
      pLVar36 = extraout_RDX_14;
      if ((bStack_a1 & 0x10) == 0) goto LAB_0020d4ab;
      puVar28 = (uint *)UntypedMapBase::GetValue<int>
                                  ((UntypedMapBase *)this._M_head_impl,(NodeBase *)node);
      uVar15 = *puVar28;
      puVar28 = *(uint **)(aStack_80.data + 8);
      node_00 = (LogMessageData *)(long)(short)*puVar28;
      _Var43._M_head_impl = (LogMessageData *)(ulong)(*puVar28 >> 0x10);
      pLVar36 = (LogMessageData *)(((long)(int)uVar15 - (long)node_00) - (long)_Var43._M_head_impl);
      if ((LogMessageData *)((long)(int)uVar15 - (long)node_00) < _Var43._M_head_impl)
      goto LAB_0020d4ab;
      uVar14 = puVar28[1];
      node_00 = (LogMessageData *)(ulong)uVar14;
      _Var43._M_head_impl = (LogMessageData *)(ulong)(ushort)uVar14;
      if (pLVar36 < _Var43._M_head_impl) {
        if ((puVar28[((ulong)pLVar36 >> 5) + 2] >> ((uint)pLVar36 & 0x1f) & 1) != 0)
        goto LAB_0020d4ab;
      }
      else {
        pLVar36 = (LogMessageData *)(ulong)(uVar14 >> 0x10);
        node_00 = (LogMessageData *)0x0;
        while (node_00 < pLVar36) {
          uVar3 = *(uint *)((long)puVar28 + (long)node_00 * 4 + (ulong)(uVar14 >> 3 & 0x1ffc) + 8);
          _Var43._M_head_impl = (LogMessageData *)(ulong)uVar3;
          pTVar25 = (TcParseTableBase *)(ulong)((int)uVar15 < (int)uVar3);
          node_00 = (LogMessageData *)(((long)node_00 * 2 - (long)pTVar25) + 2);
          if (uVar3 == uVar15) goto LAB_0020d4ab;
        }
      }
      WriteMapEntryAsUnknown
                (msg,table,(UntypedMapBase *)this._M_head_impl,uVar42,(NodeBase *)node,
                 SUB85(uStack_58,0));
    } while( true );
  case 1:
switchD_0020d4d0_caseD_1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)this._M_head_impl,(KeyNode *)node);
    goto LAB_0020d504;
  case 2:
switchD_0020d4d0_caseD_2:
    node_00 = node;
    _Var43._M_head_impl = this._M_head_impl;
code_r0x0020d4e5:
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)_Var43._M_head_impl,(KeyNode *)node_00);
    goto LAB_0020d504;
  case 5:
switchD_0020d4d0_caseD_5:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this._M_head_impl,(KeyNode *)node);
    goto LAB_0020d504;
  case 6:
switchD_0020d4d0_caseD_6:
    switch(uVar15) {
    case 0:
      goto switchD_0020d4d0_caseD_0;
    case 1:
      goto switchD_0020d4d0_caseD_1;
    case 2:
      goto switchD_0020d4d0_caseD_2;
    default:
      break;
    case 5:
      goto switchD_0020d4d0_caseD_5;
    case 6:
      goto switchD_0020d4d0_caseD_6;
    case 7:
      goto switchD_0020d4d0_caseD_7;
    case 8:
      goto switchD_0020d4d0_caseD_8;
    case 9:
      goto switchD_0020d4d0_caseD_9;
    case 10:
      goto switchD_0020d4d0_caseD_a;
    case 0xb:
      goto switchD_0020d4d0_caseD_b;
    case 0xc:
      goto switchD_0020d4d0_caseD_c;
    case 0xd:
    case 0xe:
      goto switchD_0020d4d0_caseD_d;
    case 0xf:
      goto switchD_0020d4d0_caseD_f;
    }
  case 7:
switchD_0020d4d0_caseD_7:
    pcVar18 = (char *)((long)&UINT_002c0eb8 + uVar29 + 3);
    *pcVar18 = *pcVar18 + '8';
    halt_baddata();
  case 8:
switchD_0020d4d0_caseD_8:
    pcVar18 = _Var43._M_head_impl[0x5e].encoded_buf._M_elems + 0x319f;
    *pcVar18 = *pcVar18 + bVar12;
    UINT_002c0eb8._1_1_ = 0x25;
    *(byte *)&(pLVar36->entry).full_filename_._M_len =
         *(char *)&(pLVar36->entry).full_filename_._M_len + bVar12;
switchD_0020d4d0_caseD_9:
    *(byte *)puVar28 = (byte)*puVar28 + bVar12;
    bVar11 = (byte)*puVar28 == 0;
code_r0x0020d847:
    if (!bVar11) {
      pcVar30 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)puVar28,0x200,"xform_val == +field_layout::kTvZigZag");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffff38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x87a,pcVar30);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffff38);
    }
    pcVar18 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                        ((MessageLite *)_Var43._M_head_impl,(char *)node_00,(ParseContext *)pLVar36,
                         (TcFieldData)data_01,pTVar25,(uint64_t)pFVar17);
    return pcVar18;
  case 9:
    goto switchD_0020d4d0_caseD_9;
  case 10:
switchD_0020d4d0_caseD_a:
    *(byte *)puVar28 = (byte)*puVar28 + bVar12;
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this._M_head_impl,(map_index_t)ctx,(KeyNode *)pLVar27);
    *(int *)&((this._M_head_impl)->entry).full_filename_._M_len =
         *(int *)&((this._M_head_impl)->entry).full_filename_._M_len + 1;
    return (char *)(CONCAT71((int7)(uVar40 >> 8),uVar55 == 0) & 0xffffffff);
  case 0xb:
switchD_0020d4d0_caseD_b:
    puVar28 = (uint *)(ulong)(*(byte *)((long)&((_Var43._M_head_impl)->entry).full_filename_._M_str
                                       + 7) & 0xf);
  case 0xf:
switchD_0020d4d0_caseD_f:
    if (5 < (uint)puVar28) {
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ();
    }
    data_01 = &switchD_002112dc::switchdataD_002c0f60;
code_r0x002112d5:
    pcVar18 = (char *)(*(code *)((long)(int)data_01[(long)puVar28] + (long)data_01))();
    return pcVar18;
  case 0xc:
switchD_0020d4d0_caseD_c:
    if (SCARRY8(uVar29,0x2c0f38) != (long)puVar28 < 0) {
      return (char *)_Var60._M_head_impl;
    }
    pcVar18 = (char *)((long)&switchD_00209b32::switchdataD_002c0ec4 + uVar29 + 1);
    *pcVar18 = *pcVar18 + '8' + (0xffffffffffd3f0c7 < uVar29);
    puVar28 = (uint *)(ulong)((uint)puVar28 | 0xafc8b);
    goto code_r0x002112d5;
  case 0xd:
  case 0xe:
switchD_0020d4d0_caseD_d:
    puVar28 = (uint *)CONCAT71((int7)((ulong)puVar28 >> 8),bVar12 | (byte)*puVar28);
    goto code_r0x002112d5;
  }
  goto switchD_0020d4d0_caseD_3;
LAB_0020d4ab:
  uVar15 = *(uint *)((long)this._M_head_impl + 0xc) >> 0x18;
  if (5 < ((byte)(*(uint *)((long)this._M_head_impl + 0xc) >> 0x18) & 0xf)) {
switchD_0020d4d0_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x0020d4bf;
}

Assistant:

const char* TcParser::FastEndGroupImpl(PROTOBUF_TC_PARAM_DECL) {
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  ctx->SetLastTag(data.decoded_tag());
  ptr += sizeof(TagType);
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}